

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx2::CurveNiIntersectorK<8,4>::
     occluded_t<embree::avx2::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Primitive PVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  int iVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  bool bVar54;
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  bool bVar66;
  undefined1 auVar67 [12];
  bool bVar68;
  bool bVar69;
  bool bVar70;
  bool bVar71;
  bool bVar72;
  bool bVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  uint uVar96;
  uint uVar97;
  ulong uVar98;
  byte unaff_BL;
  long lVar99;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  ulong uVar100;
  undefined4 uVar101;
  ulong uVar102;
  ulong uVar103;
  float fVar104;
  float fVar106;
  float fVar127;
  float fVar129;
  undefined1 auVar107 [16];
  float fVar105;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar128;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 extraout_var [60];
  undefined1 auVar126 [64];
  undefined1 extraout_var_00 [60];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar138 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar144 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  float fVar163;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar184;
  float fVar185;
  undefined1 auVar174 [32];
  float fVar186;
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar168 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [64];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  float fVar206;
  float fVar218;
  float fVar220;
  float fVar222;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar221;
  undefined1 auVar213 [32];
  undefined1 auVar212 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  float fVar217;
  float fVar219;
  undefined1 auVar216 [64];
  undefined1 auVar223 [16];
  undefined1 auVar228 [28];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined8 uVar234;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  float fVar246;
  float fVar247;
  undefined1 auVar245 [64];
  float fVar257;
  float fVar258;
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar260 [16];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  float fVar259;
  float fVar265;
  float fVar266;
  float fVar268;
  float fVar269;
  float fVar270;
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  float fVar267;
  undefined1 auVar263 [32];
  undefined1 auVar264 [64];
  float fVar273;
  undefined1 in_ZMM10 [64];
  undefined1 auVar272 [64];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  float fVar279;
  float fVar280;
  float fVar281;
  float fVar282;
  undefined1 auVar277 [32];
  undefined1 auVar283 [16];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  float fVar291;
  undefined1 in_ZMM12 [64];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [16];
  float fVar297;
  float fVar300;
  float fVar301;
  float fVar302;
  float fVar303;
  float fVar304;
  float fVar305;
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  RTCFilterFunctionNArguments args;
  float P_err;
  Vec3fa dir;
  vboolx_conflict valid;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  bool local_b91;
  undefined8 local_b00;
  undefined8 uStack_af8;
  ulong local_af0;
  float local_ae8;
  float local_ae4;
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [8];
  float fStack_a98;
  float fStack_a94;
  undefined4 uStack_a90;
  undefined4 uStack_a8c;
  undefined4 uStack_a88;
  undefined4 uStack_a84;
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  undefined1 local_a70 [16];
  undefined1 local_a60 [16];
  undefined1 local_a50 [16];
  undefined1 local_a40 [8];
  float fStack_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float fStack_a28;
  undefined1 local_a20 [32];
  undefined8 *local_9f8;
  RTCFilterFunctionNArguments local_9f0;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  undefined1 local_940 [32];
  undefined1 local_910 [16];
  undefined1 local_900 [16];
  undefined1 local_8f0 [16];
  undefined1 local_8e0 [16];
  Primitive *local_8d0;
  ulong local_8c8;
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  undefined1 local_8a0 [32];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [32];
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [16];
  undefined1 auStack_730 [16];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  uint local_6e0;
  uint uStack_6dc;
  uint uStack_6d8;
  uint uStack_6d4;
  uint local_6d0;
  uint uStack_6cc;
  uint uStack_6c8;
  uint uStack_6c4;
  RTCHitN local_6c0 [16];
  undefined1 auStack_6b0 [16];
  undefined4 local_6a0;
  undefined4 uStack_69c;
  undefined4 uStack_698;
  undefined4 uStack_694;
  float local_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [16];
  undefined8 local_670;
  undefined8 uStack_668;
  undefined1 local_660 [16];
  uint local_650;
  uint uStack_64c;
  uint uStack_648;
  uint uStack_644;
  uint uStack_640;
  uint uStack_63c;
  uint uStack_638;
  uint uStack_634;
  ulong local_620;
  undefined1 auStack_618 [24];
  uint local_600;
  uint uStack_5fc;
  uint uStack_5f8;
  uint uStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  uint uStack_5e4;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined4 local_460;
  undefined4 uStack_45c;
  undefined4 uStack_458;
  undefined4 uStack_454;
  undefined4 uStack_450;
  undefined4 uStack_44c;
  undefined4 uStack_448;
  undefined4 uStack_444;
  undefined4 local_440;
  undefined4 uStack_43c;
  undefined4 uStack_438;
  undefined4 uStack_434;
  undefined4 uStack_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  undefined4 local_280;
  undefined4 uStack_27c;
  undefined4 uStack_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined4 uStack_268;
  undefined4 uStack_264;
  undefined1 local_260 [32];
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar231 [32];
  undefined1 auVar271 [16];
  undefined1 auVar278 [64];
  undefined1 auVar290 [64];
  
  PVar5 = prim[1];
  uVar103 = (ulong)(byte)PVar5;
  auVar8 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x10
                        );
  auVar8 = vinsertps_avx(auVar8,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar260 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar260 = vinsertps_avx(auVar260,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar104 = *(float *)(prim + uVar103 * 0x19 + 0x12);
  auVar8 = vsubps_avx(auVar8,*(undefined1 (*) [16])(prim + uVar103 * 0x19 + 6));
  auVar107._0_4_ = fVar104 * auVar8._0_4_;
  auVar107._4_4_ = fVar104 * auVar8._4_4_;
  auVar107._8_4_ = fVar104 * auVar8._8_4_;
  auVar107._12_4_ = fVar104 * auVar8._12_4_;
  auVar235._0_4_ = fVar104 * auVar260._0_4_;
  auVar235._4_4_ = fVar104 * auVar260._4_4_;
  auVar235._8_4_ = fVar104 * auVar260._8_4_;
  auVar235._12_4_ = fVar104 * auVar260._12_4_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar103 * 4 + 6);
  auVar122 = vpmovsxbd_avx2(auVar8);
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar260._8_8_ = 0;
  auVar260._0_8_ = *(ulong *)(prim + uVar103 * 5 + 6);
  auVar232 = vpmovsxbd_avx2(auVar260);
  auVar232 = vcvtdq2ps_avx(auVar232);
  auVar113._8_8_ = 0;
  auVar113._0_8_ = *(ulong *)(prim + uVar103 * 6 + 6);
  auVar10 = vpmovsxbd_avx2(auVar113);
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar296._8_8_ = 0;
  auVar296._0_8_ = *(ulong *)(prim + uVar103 * 0xb + 6);
  auVar11 = vpmovsxbd_avx2(auVar296);
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar5 * 0xc) + 6);
  auVar12 = vpmovsxbd_avx2(auVar1);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)(prim + (uint)(byte)PVar5 * 0xc + uVar103 + 6);
  auVar120 = vpmovsxbd_avx2(auVar2);
  auVar120 = vcvtdq2ps_avx(auVar120);
  uVar102 = (ulong)(uint)((int)(uVar103 * 9) * 2);
  auVar141._8_8_ = 0;
  auVar141._0_8_ = *(ulong *)(prim + uVar102 + 6);
  auVar13 = vpmovsxbd_avx2(auVar141);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar102 + uVar103 + 6);
  auVar253 = vpmovsxbd_avx2(auVar3);
  auVar253 = vcvtdq2ps_avx(auVar253);
  uVar102 = (ulong)(uint)((int)(uVar103 * 5) << 2);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar102 + 6);
  auVar145 = vpmovsxbd_avx2(auVar4);
  auVar145 = vcvtdq2ps_avx(auVar145);
  auVar284._4_4_ = auVar235._0_4_;
  auVar284._0_4_ = auVar235._0_4_;
  auVar284._8_4_ = auVar235._0_4_;
  auVar284._12_4_ = auVar235._0_4_;
  auVar284._16_4_ = auVar235._0_4_;
  auVar284._20_4_ = auVar235._0_4_;
  auVar284._24_4_ = auVar235._0_4_;
  auVar284._28_4_ = auVar235._0_4_;
  auVar8 = vmovshdup_avx(auVar235);
  uVar234 = auVar8._0_8_;
  auVar298._8_8_ = uVar234;
  auVar298._0_8_ = uVar234;
  auVar298._16_8_ = uVar234;
  auVar298._24_8_ = uVar234;
  auVar8 = vshufps_avx(auVar235,auVar235,0xaa);
  fVar104 = auVar8._0_4_;
  auVar245._0_4_ = fVar104 * auVar10._0_4_;
  fVar127 = auVar8._4_4_;
  auVar245._4_4_ = fVar127 * auVar10._4_4_;
  auVar245._8_4_ = fVar104 * auVar10._8_4_;
  auVar245._12_4_ = fVar127 * auVar10._12_4_;
  auVar245._16_4_ = fVar104 * auVar10._16_4_;
  auVar245._20_4_ = fVar127 * auVar10._20_4_;
  auVar245._28_36_ = in_ZMM12._28_36_;
  auVar245._24_4_ = fVar104 * auVar10._24_4_;
  auVar216._0_4_ = auVar120._0_4_ * fVar104;
  auVar216._4_4_ = auVar120._4_4_ * fVar127;
  auVar216._8_4_ = auVar120._8_4_ * fVar104;
  auVar216._12_4_ = auVar120._12_4_ * fVar127;
  auVar216._16_4_ = auVar120._16_4_ * fVar104;
  auVar216._20_4_ = auVar120._20_4_ * fVar127;
  auVar216._28_36_ = in_ZMM10._28_36_;
  auVar216._24_4_ = auVar120._24_4_ * fVar104;
  auVar146._0_4_ = auVar145._0_4_ * fVar104;
  auVar146._4_4_ = auVar145._4_4_ * fVar127;
  auVar146._8_4_ = auVar145._8_4_ * fVar104;
  auVar146._12_4_ = auVar145._12_4_ * fVar127;
  auVar146._16_4_ = auVar145._16_4_ * fVar104;
  auVar146._20_4_ = auVar145._20_4_ * fVar127;
  auVar146._24_4_ = auVar145._24_4_ * fVar104;
  auVar146._28_4_ = 0;
  auVar8 = vfmadd231ps_fma(auVar245._0_32_,auVar298,auVar232);
  auVar260 = vfmadd231ps_fma(auVar216._0_32_,auVar298,auVar12);
  auVar113 = vfmadd231ps_fma(auVar146,auVar253,auVar298);
  auVar296 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar284,auVar122);
  auVar260 = vfmadd231ps_fma(ZEXT1632(auVar260),auVar284,auVar11);
  auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar13,auVar284);
  auVar243._4_4_ = auVar107._0_4_;
  auVar243._0_4_ = auVar107._0_4_;
  auVar243._8_4_ = auVar107._0_4_;
  auVar243._12_4_ = auVar107._0_4_;
  auVar243._16_4_ = auVar107._0_4_;
  auVar243._20_4_ = auVar107._0_4_;
  auVar243._24_4_ = auVar107._0_4_;
  auVar243._28_4_ = auVar107._0_4_;
  auVar8 = vmovshdup_avx(auVar107);
  uVar234 = auVar8._0_8_;
  auVar299._8_8_ = uVar234;
  auVar299._0_8_ = uVar234;
  auVar299._16_8_ = uVar234;
  auVar299._24_8_ = uVar234;
  auVar8 = vshufps_avx(auVar107,auVar107,0xaa);
  fVar104 = auVar8._0_4_;
  auVar237._0_4_ = fVar104 * auVar10._0_4_;
  fVar127 = auVar8._4_4_;
  auVar237._4_4_ = fVar127 * auVar10._4_4_;
  auVar237._8_4_ = fVar104 * auVar10._8_4_;
  auVar237._12_4_ = fVar127 * auVar10._12_4_;
  auVar237._16_4_ = fVar104 * auVar10._16_4_;
  auVar237._20_4_ = fVar127 * auVar10._20_4_;
  auVar237._24_4_ = fVar104 * auVar10._24_4_;
  auVar237._28_4_ = 0;
  auVar9._4_4_ = auVar120._4_4_ * fVar127;
  auVar9._0_4_ = auVar120._0_4_ * fVar104;
  auVar9._8_4_ = auVar120._8_4_ * fVar104;
  auVar9._12_4_ = auVar120._12_4_ * fVar127;
  auVar9._16_4_ = auVar120._16_4_ * fVar104;
  auVar9._20_4_ = auVar120._20_4_ * fVar127;
  auVar9._24_4_ = auVar120._24_4_ * fVar104;
  auVar9._28_4_ = auVar10._28_4_;
  auVar10._4_4_ = auVar145._4_4_ * fVar127;
  auVar10._0_4_ = auVar145._0_4_ * fVar104;
  auVar10._8_4_ = auVar145._8_4_ * fVar104;
  auVar10._12_4_ = auVar145._12_4_ * fVar127;
  auVar10._16_4_ = auVar145._16_4_ * fVar104;
  auVar10._20_4_ = auVar145._20_4_ * fVar127;
  auVar10._24_4_ = auVar145._24_4_ * fVar104;
  auVar10._28_4_ = fVar127;
  auVar8 = vfmadd231ps_fma(auVar237,auVar299,auVar232);
  auVar1 = vfmadd231ps_fma(auVar9,auVar299,auVar12);
  auVar2 = vfmadd231ps_fma(auVar10,auVar299,auVar253);
  auVar141 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar243,auVar122);
  local_860._8_4_ = 0x7fffffff;
  local_860._0_8_ = 0x7fffffff7fffffff;
  local_860._12_4_ = 0x7fffffff;
  local_860._16_4_ = 0x7fffffff;
  local_860._20_4_ = 0x7fffffff;
  local_860._24_4_ = 0x7fffffff;
  local_860._28_4_ = 0x7fffffff;
  auVar1 = vfmadd231ps_fma(ZEXT1632(auVar1),auVar243,auVar11);
  auVar122 = vandps_avx(ZEXT1632(auVar296),local_860);
  auVar261._8_4_ = 0x219392ef;
  auVar261._0_8_ = 0x219392ef219392ef;
  auVar261._12_4_ = 0x219392ef;
  auVar261._16_4_ = 0x219392ef;
  auVar261._20_4_ = 0x219392ef;
  auVar261._24_4_ = 0x219392ef;
  auVar261._28_4_ = 0x219392ef;
  auVar122 = vcmpps_avx(auVar122,auVar261,1);
  auVar232 = vblendvps_avx(ZEXT1632(auVar296),auVar261,auVar122);
  auVar122 = vandps_avx(ZEXT1632(auVar260),local_860);
  auVar122 = vcmpps_avx(auVar122,auVar261,1);
  auVar10 = vblendvps_avx(ZEXT1632(auVar260),auVar261,auVar122);
  auVar122 = vandps_avx(ZEXT1632(auVar113),local_860);
  auVar122 = vcmpps_avx(auVar122,auVar261,1);
  auVar11 = vrcpps_avx(auVar232);
  auVar122 = vblendvps_avx(ZEXT1632(auVar113),auVar261,auVar122);
  auVar175._8_4_ = 0x3f800000;
  auVar175._0_8_ = &DAT_3f8000003f800000;
  auVar175._12_4_ = 0x3f800000;
  auVar175._16_4_ = 0x3f800000;
  auVar175._20_4_ = 0x3f800000;
  auVar175._24_4_ = 0x3f800000;
  auVar175._28_4_ = 0x3f800000;
  auVar296 = vfmadd231ps_fma(ZEXT1632(auVar2),auVar243,auVar13);
  auVar12 = vrcpps_avx(auVar10);
  auVar8 = vfnmadd213ps_fma(auVar232,auVar11,auVar175);
  auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar11,auVar11);
  auVar260 = vfnmadd213ps_fma(auVar10,auVar12,auVar175);
  auVar260 = vfmadd132ps_fma(ZEXT1632(auVar260),auVar12,auVar12);
  auVar232 = vrcpps_avx(auVar122);
  auVar113 = vfnmadd213ps_fma(auVar122,auVar232,auVar175);
  auVar122 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar103 * 7 + 6));
  auVar113 = vfmadd132ps_fma(ZEXT1632(auVar113),auVar232,auVar232);
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar122 = vsubps_avx(auVar122,ZEXT1632(auVar141));
  auVar11._4_4_ = auVar8._4_4_ * auVar122._4_4_;
  auVar11._0_4_ = auVar8._0_4_ * auVar122._0_4_;
  auVar11._8_4_ = auVar8._8_4_ * auVar122._8_4_;
  auVar11._12_4_ = auVar8._12_4_ * auVar122._12_4_;
  auVar11._16_4_ = auVar122._16_4_ * 0.0;
  auVar11._20_4_ = auVar122._20_4_ * 0.0;
  auVar11._24_4_ = auVar122._24_4_ * 0.0;
  auVar11._28_4_ = auVar122._28_4_;
  auVar122 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar103 * 9 + 6));
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar122 = vsubps_avx(auVar122,ZEXT1632(auVar141));
  auVar229._0_4_ = auVar8._0_4_ * auVar122._0_4_;
  auVar229._4_4_ = auVar8._4_4_ * auVar122._4_4_;
  auVar229._8_4_ = auVar8._8_4_ * auVar122._8_4_;
  auVar229._12_4_ = auVar8._12_4_ * auVar122._12_4_;
  auVar229._16_4_ = auVar122._16_4_ * 0.0;
  auVar229._20_4_ = auVar122._20_4_ * 0.0;
  auVar229._24_4_ = auVar122._24_4_ * 0.0;
  auVar229._28_4_ = 0;
  auVar145._1_3_ = 0;
  auVar145[0] = PVar5;
  auVar232 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar5 * 0x10 + 6));
  auVar122 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar5 * 0x10 + uVar103 * -2 + 6));
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar122 = vsubps_avx(auVar122,ZEXT1632(auVar1));
  auVar12._4_4_ = auVar122._4_4_ * auVar260._4_4_;
  auVar12._0_4_ = auVar122._0_4_ * auVar260._0_4_;
  auVar12._8_4_ = auVar122._8_4_ * auVar260._8_4_;
  auVar12._12_4_ = auVar122._12_4_ * auVar260._12_4_;
  auVar12._16_4_ = auVar122._16_4_ * 0.0;
  auVar12._20_4_ = auVar122._20_4_ * 0.0;
  auVar12._24_4_ = auVar122._24_4_ * 0.0;
  auVar12._28_4_ = auVar122._28_4_;
  auVar122 = vcvtdq2ps_avx(auVar232);
  auVar122 = vsubps_avx(auVar122,ZEXT1632(auVar1));
  auVar120._4_4_ = auVar260._4_4_ * auVar122._4_4_;
  auVar120._0_4_ = auVar260._0_4_ * auVar122._0_4_;
  auVar120._8_4_ = auVar260._8_4_ * auVar122._8_4_;
  auVar120._12_4_ = auVar260._12_4_ * auVar122._12_4_;
  auVar120._16_4_ = auVar122._16_4_ * 0.0;
  auVar120._20_4_ = auVar122._20_4_ * 0.0;
  auVar120._24_4_ = auVar122._24_4_ * 0.0;
  auVar120._28_4_ = auVar122._28_4_;
  auVar122 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar102 + uVar103 + 6));
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar122 = vsubps_avx(auVar122,ZEXT1632(auVar296));
  auVar13._4_4_ = auVar122._4_4_ * auVar113._4_4_;
  auVar13._0_4_ = auVar122._0_4_ * auVar113._0_4_;
  auVar13._8_4_ = auVar122._8_4_ * auVar113._8_4_;
  auVar13._12_4_ = auVar122._12_4_ * auVar113._12_4_;
  auVar13._16_4_ = auVar122._16_4_ * 0.0;
  auVar13._20_4_ = auVar122._20_4_ * 0.0;
  auVar13._24_4_ = auVar122._24_4_ * 0.0;
  auVar13._28_4_ = auVar122._28_4_;
  auVar122 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar103 * 0x17 + 6));
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar122 = vsubps_avx(auVar122,ZEXT1632(auVar296));
  auVar253._4_4_ = auVar113._4_4_ * auVar122._4_4_;
  auVar253._0_4_ = auVar113._0_4_ * auVar122._0_4_;
  auVar253._8_4_ = auVar113._8_4_ * auVar122._8_4_;
  auVar253._12_4_ = auVar113._12_4_ * auVar122._12_4_;
  auVar253._16_4_ = auVar122._16_4_ * 0.0;
  auVar253._20_4_ = auVar122._20_4_ * 0.0;
  auVar253._24_4_ = auVar122._24_4_ * 0.0;
  auVar253._28_4_ = auVar122._28_4_;
  auVar122 = vpminsd_avx2(auVar11,auVar229);
  auVar232 = vpminsd_avx2(auVar12,auVar120);
  auVar122 = vmaxps_avx(auVar122,auVar232);
  auVar232 = vpminsd_avx2(auVar13,auVar253);
  uVar101 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar262._4_4_ = uVar101;
  auVar262._0_4_ = uVar101;
  auVar262._8_4_ = uVar101;
  auVar262._12_4_ = uVar101;
  auVar262._16_4_ = uVar101;
  auVar262._20_4_ = uVar101;
  auVar262._24_4_ = uVar101;
  auVar262._28_4_ = uVar101;
  auVar232 = vmaxps_avx(auVar232,auVar262);
  auVar122 = vmaxps_avx(auVar122,auVar232);
  local_2e0._4_4_ = auVar122._4_4_ * 0.99999964;
  local_2e0._0_4_ = auVar122._0_4_ * 0.99999964;
  local_2e0._8_4_ = auVar122._8_4_ * 0.99999964;
  local_2e0._12_4_ = auVar122._12_4_ * 0.99999964;
  local_2e0._16_4_ = auVar122._16_4_ * 0.99999964;
  local_2e0._20_4_ = auVar122._20_4_ * 0.99999964;
  local_2e0._24_4_ = auVar122._24_4_ * 0.99999964;
  local_2e0._28_4_ = 0x3f7ffffa;
  auVar122 = vpmaxsd_avx2(auVar11,auVar229);
  auVar232 = vpmaxsd_avx2(auVar12,auVar120);
  auVar122 = vminps_avx(auVar122,auVar232);
  auVar232 = vpmaxsd_avx2(auVar13,auVar253);
  uVar101 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar174._4_4_ = uVar101;
  auVar174._0_4_ = uVar101;
  auVar174._8_4_ = uVar101;
  auVar174._12_4_ = uVar101;
  auVar174._16_4_ = uVar101;
  auVar174._20_4_ = uVar101;
  auVar174._24_4_ = uVar101;
  auVar174._28_4_ = uVar101;
  auVar232 = vminps_avx(auVar232,auVar174);
  auVar122 = vminps_avx(auVar122,auVar232);
  auVar232._4_4_ = auVar122._4_4_ * 1.0000004;
  auVar232._0_4_ = auVar122._0_4_ * 1.0000004;
  auVar232._8_4_ = auVar122._8_4_ * 1.0000004;
  auVar232._12_4_ = auVar122._12_4_ * 1.0000004;
  auVar232._16_4_ = auVar122._16_4_ * 1.0000004;
  auVar232._20_4_ = auVar122._20_4_ * 1.0000004;
  auVar232._24_4_ = auVar122._24_4_ * 1.0000004;
  auVar232._28_4_ = auVar122._28_4_;
  auVar145[4] = PVar5;
  auVar145._5_3_ = 0;
  auVar145[8] = PVar5;
  auVar145._9_3_ = 0;
  auVar145[0xc] = PVar5;
  auVar145._13_3_ = 0;
  auVar145[0x10] = PVar5;
  auVar145._17_3_ = 0;
  auVar145[0x14] = PVar5;
  auVar145._21_3_ = 0;
  auVar145[0x18] = PVar5;
  auVar145._25_3_ = 0;
  auVar145[0x1c] = PVar5;
  auVar145._29_3_ = 0;
  auVar122 = vcmpps_avx(local_2e0,auVar232,2);
  auVar232 = vpcmpgtd_avx2(auVar145,_DAT_0205a920);
  auVar122 = vandps_avx(auVar122,auVar232);
  uVar96 = vmovmskps_avx(auVar122);
  local_b91 = uVar96 != 0;
  if (uVar96 == 0) {
    return local_b91;
  }
  uVar96 = uVar96 & 0xff;
  auVar122._16_16_ = mm_lookupmask_ps._240_16_;
  auVar122._0_16_ = mm_lookupmask_ps._240_16_;
  local_2a0 = vblendps_avx(auVar122,ZEXT832(0) << 0x20,0x80);
  local_9f8 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_600 = 0x80000000;
  uStack_5fc = 0x80000000;
  uStack_5f8 = 0x80000000;
  uStack_5f4 = 0x80000000;
  fStack_5f0 = -0.0;
  fStack_5ec = -0.0;
  fStack_5e8 = -0.0;
  uStack_5e4 = 0x80000000;
  local_8d0 = prim;
LAB_018e2f15:
  lVar99 = 0;
  local_8c8 = (ulong)uVar96;
  for (uVar102 = local_8c8; (uVar102 & 1) == 0; uVar102 = uVar102 >> 1 | 0x8000000000000000) {
    lVar99 = lVar99 + 1;
  }
  local_6d0 = *(uint *)(local_8d0 + 2);
  local_af0 = (ulong)local_6d0;
  local_6e0 = *(uint *)(local_8d0 + lVar99 * 4 + 6);
  pGVar6 = (context->scene->geometries).items[local_af0].ptr;
  uVar102 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                            pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i * (ulong)local_6e0);
  p_Var7 = pGVar6[1].intersectionFilterN;
  lVar99 = *(long *)&pGVar6[1].time_range.upper;
  auVar8 = *(undefined1 (*) [16])(lVar99 + (long)p_Var7 * uVar102);
  auVar260 = *(undefined1 (*) [16])(lVar99 + (uVar102 + 1) * (long)p_Var7);
  auVar113 = *(undefined1 (*) [16])(lVar99 + (uVar102 + 2) * (long)p_Var7);
  local_8c8 = local_8c8 - 1 & local_8c8;
  auVar296 = *(undefined1 (*) [16])(lVar99 + (uVar102 + 3) * (long)p_Var7);
  if (local_8c8 != 0) {
    uVar103 = local_8c8 - 1 & local_8c8;
    for (uVar102 = local_8c8; (uVar102 & 1) == 0; uVar102 = uVar102 >> 1 | 0x8000000000000000) {
    }
    if (uVar103 != 0) {
      for (; (uVar103 & 1) == 0; uVar103 = uVar103 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar1 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c
                        );
  auVar2 = vinsertps_avx(auVar1,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar101 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar271._4_4_ = uVar101;
  auVar271._0_4_ = uVar101;
  auVar271._8_4_ = uVar101;
  auVar271._12_4_ = uVar101;
  fStack_a30 = (float)uVar101;
  _local_a40 = auVar271;
  fStack_a2c = (float)uVar101;
  fStack_a28 = (float)uVar101;
  register0x0000149c = uVar101;
  auVar272 = ZEXT3264(_local_a40);
  uVar101 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar274._4_4_ = uVar101;
  auVar274._0_4_ = uVar101;
  auVar274._8_4_ = uVar101;
  auVar274._12_4_ = uVar101;
  fStack_830 = (float)uVar101;
  _local_840 = auVar274;
  fStack_82c = (float)uVar101;
  fStack_828 = (float)uVar101;
  register0x000014dc = uVar101;
  auVar278 = ZEXT3264(_local_840);
  auVar1 = vunpcklps_avx(auVar271,auVar274);
  fVar104 = *(float *)(ray + k * 4 + 0x60);
  auVar283._4_4_ = fVar104;
  auVar283._0_4_ = fVar104;
  auVar283._8_4_ = fVar104;
  auVar283._12_4_ = fVar104;
  fStack_950 = fVar104;
  _local_960 = auVar283;
  fStack_94c = fVar104;
  fStack_948 = fVar104;
  register0x0000151c = fVar104;
  auVar290 = ZEXT3264(_local_960);
  local_900 = vinsertps_avx(auVar1,auVar283,0x28);
  auVar223._0_4_ = (auVar8._0_4_ + auVar260._0_4_ + auVar113._0_4_ + auVar296._0_4_) * 0.25;
  auVar223._4_4_ = (auVar8._4_4_ + auVar260._4_4_ + auVar113._4_4_ + auVar296._4_4_) * 0.25;
  auVar223._8_4_ = (auVar8._8_4_ + auVar260._8_4_ + auVar113._8_4_ + auVar296._8_4_) * 0.25;
  auVar223._12_4_ = (auVar8._12_4_ + auVar260._12_4_ + auVar113._12_4_ + auVar296._12_4_) * 0.25;
  auVar1 = vsubps_avx(auVar223,auVar2);
  auVar1 = vdpps_avx(auVar1,local_900,0x7f);
  local_910 = vdpps_avx(local_900,local_900,0x7f);
  auVar264 = ZEXT1664(local_910);
  auVar141 = vrcpss_avx(local_910,local_910);
  auVar3 = vfnmadd213ss_fma(auVar141,local_910,ZEXT416(0x40000000));
  fVar127 = auVar1._0_4_ * auVar141._0_4_ * auVar3._0_4_;
  auVar236._4_4_ = fVar127;
  auVar236._0_4_ = fVar127;
  auVar236._8_4_ = fVar127;
  auVar236._12_4_ = fVar127;
  auVar1 = vfmadd231ps_fma(auVar2,local_900,auVar236);
  auVar1 = vblendps_avx(auVar1,_DAT_01feba10,8);
  local_a50 = vsubps_avx(auVar8,auVar1);
  local_a60 = vsubps_avx(auVar113,auVar1);
  local_a70 = vsubps_avx(auVar260,auVar1);
  _local_a80 = vsubps_avx(auVar296,auVar1);
  auVar8 = vmovshdup_avx(local_a50);
  local_1a0 = auVar8._0_8_;
  uStack_198 = local_1a0;
  uStack_190 = local_1a0;
  uStack_188 = local_1a0;
  auVar8 = vshufps_avx(local_a50,local_a50,0xaa);
  local_1c0 = auVar8._0_8_;
  uStack_1b8 = local_1c0;
  uStack_1b0 = local_1c0;
  uStack_1a8 = local_1c0;
  auVar8 = vshufps_avx(local_a50,local_a50,0xff);
  local_1e0 = auVar8._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar8 = vmovshdup_avx(local_a70);
  local_380 = auVar8._0_8_;
  uStack_378 = local_380;
  uStack_370 = local_380;
  uStack_368 = local_380;
  auVar8 = vshufps_avx(local_a70,local_a70,0xaa);
  local_3a0 = auVar8._0_8_;
  uStack_398 = local_3a0;
  uStack_390 = local_3a0;
  uStack_388 = local_3a0;
  auVar8 = vshufps_avx(local_a70,local_a70,0xff);
  local_200 = auVar8._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar8 = vmovshdup_avx(local_a60);
  local_220 = auVar8._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar8 = vshufps_avx(local_a60,local_a60,0xaa);
  local_240 = auVar8._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar8 = vshufps_avx(local_a60,local_a60,0xff);
  local_3c0 = auVar8._0_8_;
  uStack_3b8 = local_3c0;
  uStack_3b0 = local_3c0;
  uStack_3a8 = local_3c0;
  auVar8 = vmovshdup_avx(_local_a80);
  local_3e0 = auVar8._0_8_;
  uStack_3d8 = local_3e0;
  uStack_3d0 = local_3e0;
  uStack_3c8 = local_3e0;
  auVar8 = vshufps_avx(_local_a80,_local_a80,0xaa);
  local_400 = auVar8._0_8_;
  uStack_3f8 = local_400;
  uStack_3f0 = local_400;
  uStack_3e8 = local_400;
  auVar8 = vshufps_avx(_local_a80,_local_a80,0xff);
  local_420 = auVar8._0_8_;
  uStack_418 = local_420;
  uStack_410 = local_420;
  uStack_408 = local_420;
  auVar8 = vfmadd231ps_fma(ZEXT432((uint)(fVar104 * fVar104)),_local_840,_local_840);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),_local_a40,_local_a40);
  uVar101 = auVar8._0_4_;
  local_260._4_4_ = uVar101;
  local_260._0_4_ = uVar101;
  local_260._8_4_ = uVar101;
  local_260._12_4_ = uVar101;
  local_260._16_4_ = uVar101;
  local_260._20_4_ = uVar101;
  local_260._24_4_ = uVar101;
  local_260._28_4_ = uVar101;
  auVar245 = ZEXT3264(local_260);
  fVar104 = *(float *)(ray + k * 4 + 0x30);
  local_8f0 = ZEXT416((uint)fVar127);
  local_2c0 = fVar104 - fVar127;
  fStack_2bc = local_2c0;
  fStack_2b8 = local_2c0;
  fStack_2b4 = local_2c0;
  fStack_2b0 = local_2c0;
  fStack_2ac = local_2c0;
  fStack_2a8 = local_2c0;
  fStack_2a4 = local_2c0;
  uVar102 = 1;
  uVar100 = 0;
  local_440 = local_a50._0_4_;
  uStack_43c = local_440;
  uStack_438 = local_440;
  uStack_434 = local_440;
  uStack_430 = local_440;
  uStack_42c = local_440;
  uStack_428 = local_440;
  uStack_424 = local_440;
  local_280 = local_a70._0_4_;
  uStack_27c = local_280;
  uStack_278 = local_280;
  uStack_274 = local_280;
  uStack_270 = local_280;
  uStack_26c = local_280;
  uStack_268 = local_280;
  uStack_264 = local_280;
  local_460 = local_a60._0_4_;
  uStack_45c = local_460;
  uStack_458 = local_460;
  uStack_454 = local_460;
  uStack_450 = local_460;
  uStack_44c = local_460;
  uStack_448 = local_460;
  uStack_444 = local_460;
  local_480 = local_a80._0_4_;
  local_4a0 = vandps_avx(local_260,local_860);
  auVar8 = vsqrtss_avx(local_910,local_910);
  local_ae4 = auVar8._0_4_;
  auVar8 = vsqrtss_avx(local_910,local_910);
  local_ae8 = auVar8._0_4_;
  local_8e0 = ZEXT816(0x3f80000000000000);
  auVar216 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  fStack_47c = local_480;
  fStack_478 = local_480;
  fStack_474 = local_480;
  fStack_470 = local_480;
  fStack_46c = local_480;
  fStack_468 = local_480;
  fStack_464 = local_480;
  uVar103 = 0;
  uStack_6dc = local_6e0;
  uStack_6d8 = local_6e0;
  uStack_6d4 = local_6e0;
  uStack_6cc = local_6d0;
  uStack_6c8 = local_6d0;
  uStack_6c4 = local_6d0;
  do {
    auVar8 = vmovshdup_avx(local_8e0);
    fVar206 = local_8e0._0_4_;
    fVar291 = auVar8._0_4_ - fVar206;
    fVar222 = fVar291 * 0.04761905;
    local_760._4_4_ = fVar206;
    local_760._0_4_ = fVar206;
    local_760._8_4_ = fVar206;
    local_760._12_4_ = fVar206;
    local_760._16_4_ = fVar206;
    local_760._20_4_ = fVar206;
    local_760._24_4_ = fVar206;
    local_760._28_4_ = fVar206;
    local_780._4_4_ = fVar291;
    local_780._0_4_ = fVar291;
    local_780._8_4_ = fVar291;
    local_780._12_4_ = fVar291;
    local_780._16_4_ = fVar291;
    local_780._20_4_ = fVar291;
    local_780._24_4_ = fVar291;
    local_780._28_4_ = fVar291;
    auVar8 = vfmadd231ps_fma(local_760,local_780,_DAT_02020f20);
    auVar122 = vsubps_avx(auVar216._0_32_,ZEXT1632(auVar8));
    fVar206 = auVar122._0_4_;
    fVar219 = auVar122._4_4_;
    fVar106 = auVar122._8_4_;
    fVar246 = auVar122._12_4_;
    fVar220 = auVar122._16_4_;
    fVar247 = auVar122._20_4_;
    fVar258 = auVar122._24_4_;
    fVar105 = fVar206 * fVar206 * fVar206;
    fVar128 = fVar219 * fVar219 * fVar219;
    fVar129 = fVar106 * fVar106 * fVar106;
    fVar130 = fVar246 * fVar246 * fVar246;
    fVar131 = fVar220 * fVar220 * fVar220;
    fVar132 = fVar247 * fVar247 * fVar247;
    fVar133 = fVar258 * fVar258 * fVar258;
    fVar217 = auVar8._0_4_;
    fVar221 = auVar8._4_4_;
    fVar218 = auVar8._8_4_;
    fVar257 = auVar8._12_4_;
    fVar163 = fVar217 * fVar217 * fVar217;
    fVar184 = fVar221 * fVar221 * fVar221;
    fVar185 = fVar218 * fVar218 * fVar218;
    fVar186 = fVar257 * fVar257 * fVar257;
    fVar259 = fVar206 * fVar217;
    fVar265 = fVar219 * fVar221;
    fVar266 = fVar106 * fVar218;
    fVar267 = fVar246 * fVar257;
    fVar268 = fVar220 * 0.0;
    fVar269 = fVar247 * 0.0;
    fVar270 = fVar258 * 0.0;
    fVar273 = auVar272._28_4_ + auVar290._28_4_;
    auVar15._4_4_ = fVar128 * 0.16666667;
    auVar15._0_4_ = fVar105 * 0.16666667;
    auVar15._8_4_ = fVar129 * 0.16666667;
    auVar15._12_4_ = fVar130 * 0.16666667;
    auVar15._16_4_ = fVar131 * 0.16666667;
    auVar15._20_4_ = fVar132 * 0.16666667;
    auVar15._24_4_ = fVar133 * 0.16666667;
    auVar15._28_4_ = fVar273 + fVar291;
    auVar16._4_4_ =
         (fVar219 * fVar265 * 12.0 + fVar265 * fVar221 * 6.0 + fVar184 + fVar128 * 4.0) * 0.16666667
    ;
    auVar16._0_4_ =
         (fVar206 * fVar259 * 12.0 + fVar259 * fVar217 * 6.0 + fVar163 + fVar105 * 4.0) * 0.16666667
    ;
    auVar16._8_4_ =
         (fVar106 * fVar266 * 12.0 + fVar266 * fVar218 * 6.0 + fVar185 + fVar129 * 4.0) * 0.16666667
    ;
    auVar16._12_4_ =
         (fVar246 * fVar267 * 12.0 + fVar267 * fVar257 * 6.0 + fVar186 + fVar130 * 4.0) * 0.16666667
    ;
    auVar16._16_4_ =
         (fVar220 * fVar268 * 12.0 + fVar268 * 0.0 * 6.0 + fVar131 * 4.0 + 0.0) * 0.16666667;
    auVar16._20_4_ =
         (fVar247 * fVar269 * 12.0 + fVar269 * 0.0 * 6.0 + fVar132 * 4.0 + 0.0) * 0.16666667;
    auVar16._24_4_ =
         (fVar258 * fVar270 * 12.0 + fVar270 * 0.0 * 6.0 + fVar133 * 4.0 + 0.0) * 0.16666667;
    auVar16._28_4_ = auVar278._28_4_;
    auVar17._4_4_ =
         (fVar184 * 4.0 + fVar128 + fVar265 * fVar221 * 12.0 + fVar219 * fVar265 * 6.0) * 0.16666667
    ;
    auVar17._0_4_ =
         (fVar163 * 4.0 + fVar105 + fVar259 * fVar217 * 12.0 + fVar206 * fVar259 * 6.0) * 0.16666667
    ;
    auVar17._8_4_ =
         (fVar185 * 4.0 + fVar129 + fVar266 * fVar218 * 12.0 + fVar106 * fVar266 * 6.0) * 0.16666667
    ;
    auVar17._12_4_ =
         (fVar186 * 4.0 + fVar130 + fVar267 * fVar257 * 12.0 + fVar246 * fVar267 * 6.0) * 0.16666667
    ;
    auVar17._16_4_ = (fVar131 + 0.0 + fVar268 * 0.0 * 12.0 + fVar220 * fVar268 * 6.0) * 0.16666667;
    auVar17._20_4_ = (fVar132 + 0.0 + fVar269 * 0.0 * 12.0 + fVar247 * fVar269 * 6.0) * 0.16666667;
    auVar17._24_4_ = (fVar133 + 0.0 + fVar270 * 0.0 * 12.0 + fVar258 * fVar270 * 6.0) * 0.16666667;
    auVar17._28_4_ = auVar290._28_4_;
    fVar163 = fVar163 * 0.16666667;
    fVar184 = fVar184 * 0.16666667;
    fVar185 = fVar185 * 0.16666667;
    fVar186 = fVar186 * 0.16666667;
    auVar18._4_4_ = fStack_47c * fVar184;
    auVar18._0_4_ = local_480 * fVar163;
    auVar18._8_4_ = fStack_478 * fVar185;
    auVar18._12_4_ = fStack_474 * fVar186;
    auVar18._16_4_ = fStack_470 * 0.0;
    auVar18._20_4_ = fStack_46c * 0.0;
    auVar18._24_4_ = fStack_468 * 0.0;
    auVar18._28_4_ = fVar273 + 0.0;
    auVar19._4_4_ = fVar184 * local_3e0._4_4_;
    auVar19._0_4_ = fVar163 * (float)local_3e0;
    auVar19._8_4_ = fVar185 * (float)uStack_3d8;
    auVar19._12_4_ = fVar186 * uStack_3d8._4_4_;
    auVar19._16_4_ = (float)uStack_3d0 * 0.0;
    auVar19._20_4_ = uStack_3d0._4_4_ * 0.0;
    auVar19._24_4_ = (float)uStack_3c8 * 0.0;
    auVar19._28_4_ = 0;
    auVar20._4_4_ = fVar184 * local_400._4_4_;
    auVar20._0_4_ = fVar163 * (float)local_400;
    auVar20._8_4_ = fVar185 * (float)uStack_3f8;
    auVar20._12_4_ = fVar186 * uStack_3f8._4_4_;
    auVar20._16_4_ = (float)uStack_3f0 * 0.0;
    auVar20._20_4_ = uStack_3f0._4_4_ * 0.0;
    auVar20._24_4_ = (float)uStack_3e8 * 0.0;
    auVar20._28_4_ = 0x40800000;
    auVar21._4_4_ = fVar184 * local_420._4_4_;
    auVar21._0_4_ = fVar163 * (float)local_420;
    auVar21._8_4_ = fVar185 * (float)uStack_418;
    auVar21._12_4_ = fVar186 * uStack_418._4_4_;
    auVar21._16_4_ = (float)uStack_410 * 0.0;
    auVar21._20_4_ = uStack_410._4_4_ * 0.0;
    auVar21._24_4_ = (float)uStack_408 * 0.0;
    auVar21._28_4_ = fVar291;
    auVar78._4_4_ = uStack_45c;
    auVar78._0_4_ = local_460;
    auVar78._8_4_ = uStack_458;
    auVar78._12_4_ = uStack_454;
    auVar78._16_4_ = uStack_450;
    auVar78._20_4_ = uStack_44c;
    auVar78._24_4_ = uStack_448;
    auVar78._28_4_ = uStack_444;
    auVar8 = vfmadd231ps_fma(auVar18,auVar17,auVar78);
    auVar91._8_8_ = uStack_218;
    auVar91._0_8_ = local_220;
    auVar91._16_8_ = uStack_210;
    auVar91._24_8_ = uStack_208;
    auVar260 = vfmadd231ps_fma(auVar19,auVar17,auVar91);
    auVar90._8_8_ = uStack_238;
    auVar90._0_8_ = local_240;
    auVar90._16_8_ = uStack_230;
    auVar90._24_8_ = uStack_228;
    auVar113 = vfmadd231ps_fma(auVar20,auVar17,auVar90);
    auVar82._8_8_ = uStack_3b8;
    auVar82._0_8_ = local_3c0;
    auVar82._16_8_ = uStack_3b0;
    auVar82._24_8_ = uStack_3a8;
    auVar296 = vfmadd231ps_fma(auVar21,auVar17,auVar82);
    auVar89._4_4_ = uStack_27c;
    auVar89._0_4_ = local_280;
    auVar89._8_4_ = uStack_278;
    auVar89._12_4_ = uStack_274;
    auVar89._16_4_ = uStack_270;
    auVar89._20_4_ = uStack_26c;
    auVar89._24_4_ = uStack_268;
    auVar89._28_4_ = uStack_264;
    auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar16,auVar89);
    auVar86._8_8_ = uStack_378;
    auVar86._0_8_ = local_380;
    auVar86._16_8_ = uStack_370;
    auVar86._24_8_ = uStack_368;
    auVar260 = vfmadd231ps_fma(ZEXT1632(auVar260),auVar16,auVar86);
    auVar84._8_8_ = uStack_398;
    auVar84._0_8_ = local_3a0;
    auVar84._16_8_ = uStack_390;
    auVar84._24_8_ = uStack_388;
    auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar16,auVar84);
    auVar92._8_8_ = uStack_1f8;
    auVar92._0_8_ = local_200;
    auVar92._16_8_ = uStack_1f0;
    auVar92._24_8_ = uStack_1e8;
    auVar296 = vfmadd231ps_fma(ZEXT1632(auVar296),auVar92,auVar16);
    auVar80._4_4_ = uStack_43c;
    auVar80._0_4_ = local_440;
    auVar80._8_4_ = uStack_438;
    auVar80._12_4_ = uStack_434;
    auVar80._16_4_ = uStack_430;
    auVar80._20_4_ = uStack_42c;
    auVar80._24_4_ = uStack_428;
    auVar80._28_4_ = uStack_424;
    auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar15,auVar80);
    auVar146 = ZEXT1632(auVar8);
    auVar95._8_8_ = uStack_198;
    auVar95._0_8_ = local_1a0;
    auVar95._16_8_ = uStack_190;
    auVar95._24_8_ = uStack_188;
    auVar8 = vfmadd231ps_fma(ZEXT1632(auVar260),auVar15,auVar95);
    auVar175 = ZEXT1632(auVar8);
    auVar94._8_8_ = uStack_1b8;
    auVar94._0_8_ = local_1c0;
    auVar94._16_8_ = uStack_1b0;
    auVar94._24_8_ = uStack_1a8;
    auVar8 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar15,auVar94);
    auVar284 = ZEXT1632(auVar8);
    auVar93._8_8_ = uStack_1d8;
    auVar93._0_8_ = local_1e0;
    auVar93._16_8_ = uStack_1d0;
    auVar93._24_8_ = uStack_1c8;
    auVar260 = vfmadd231ps_fma(ZEXT1632(auVar296),auVar93,auVar15);
    auVar238._0_4_ = (float)((uint)fVar217 ^ local_600) * fVar217;
    auVar238._4_4_ = (float)((uint)fVar221 ^ uStack_5fc) * fVar221;
    auVar238._8_4_ = (float)((uint)fVar218 ^ uStack_5f8) * fVar218;
    auVar238._12_4_ = (float)((uint)fVar257 ^ uStack_5f4) * fVar257;
    auVar238._16_4_ = fStack_5f0 * 0.0;
    auVar238._20_4_ = fStack_5ec * 0.0;
    auVar238._24_4_ = fStack_5e8 * 0.0;
    auVar238._28_4_ = 0;
    auVar22._4_4_ = fVar265 * 4.0;
    auVar22._0_4_ = fVar259 * 4.0;
    auVar22._8_4_ = fVar266 * 4.0;
    auVar22._12_4_ = fVar267 * 4.0;
    auVar22._16_4_ = fVar268 * 4.0;
    auVar22._20_4_ = fVar269 * 4.0;
    fVar291 = auVar264._28_4_;
    auVar22._24_4_ = fVar270 * 4.0;
    auVar22._28_4_ = fVar291;
    auVar232 = vsubps_avx(auVar238,auVar22);
    auVar23._4_4_ = fVar219 * (float)((uint)fVar219 ^ uStack_5fc) * 0.5;
    auVar23._0_4_ = fVar206 * (float)((uint)fVar206 ^ local_600) * 0.5;
    auVar23._8_4_ = fVar106 * (float)((uint)fVar106 ^ uStack_5f8) * 0.5;
    auVar23._12_4_ = fVar246 * (float)((uint)fVar246 ^ uStack_5f4) * 0.5;
    auVar23._16_4_ = fVar220 * (float)((uint)fVar220 ^ (uint)fStack_5f0) * 0.5;
    auVar23._20_4_ = fVar247 * (float)((uint)fVar247 ^ (uint)fStack_5ec) * 0.5;
    auVar23._24_4_ = fVar258 * (float)((uint)fVar258 ^ (uint)fStack_5e8) * 0.5;
    auVar23._28_4_ = auVar122._28_4_;
    auVar24._4_4_ = auVar232._4_4_ * 0.5;
    auVar24._0_4_ = auVar232._0_4_ * 0.5;
    auVar24._8_4_ = auVar232._8_4_ * 0.5;
    auVar24._12_4_ = auVar232._12_4_ * 0.5;
    auVar24._16_4_ = auVar232._16_4_ * 0.5;
    auVar24._20_4_ = auVar232._20_4_ * 0.5;
    auVar24._24_4_ = auVar232._24_4_ * 0.5;
    auVar24._28_4_ = auVar232._28_4_;
    auVar25._4_4_ = (fVar265 * 4.0 + fVar219 * fVar219) * 0.5;
    auVar25._0_4_ = (fVar259 * 4.0 + fVar206 * fVar206) * 0.5;
    auVar25._8_4_ = (fVar266 * 4.0 + fVar106 * fVar106) * 0.5;
    auVar25._12_4_ = (fVar267 * 4.0 + fVar246 * fVar246) * 0.5;
    auVar25._16_4_ = (fVar268 * 4.0 + fVar220 * fVar220) * 0.5;
    auVar25._20_4_ = (fVar269 * 4.0 + fVar247 * fVar247) * 0.5;
    auVar25._24_4_ = (fVar270 * 4.0 + fVar258 * fVar258) * 0.5;
    auVar25._28_4_ = fVar291 + auVar245._28_4_;
    fVar206 = fVar217 * fVar217 * 0.5;
    fVar217 = fVar221 * fVar221 * 0.5;
    fVar219 = fVar218 * fVar218 * 0.5;
    fVar221 = fVar257 * fVar257 * 0.5;
    auVar26._4_4_ = fVar217 * fStack_47c;
    auVar26._0_4_ = fVar206 * local_480;
    auVar26._8_4_ = fVar219 * fStack_478;
    auVar26._12_4_ = fVar221 * fStack_474;
    auVar26._16_4_ = fStack_470 * 0.0;
    auVar26._20_4_ = fStack_46c * 0.0;
    auVar26._24_4_ = fStack_468 * 0.0;
    auVar26._28_4_ = fVar291;
    auVar27._4_4_ = fVar217 * local_3e0._4_4_;
    auVar27._0_4_ = fVar206 * (float)local_3e0;
    auVar27._8_4_ = fVar219 * (float)uStack_3d8;
    auVar27._12_4_ = fVar221 * uStack_3d8._4_4_;
    auVar27._16_4_ = (float)uStack_3d0 * 0.0;
    auVar27._20_4_ = uStack_3d0._4_4_ * 0.0;
    auVar27._24_4_ = (float)uStack_3c8 * 0.0;
    auVar27._28_4_ = uStack_5e4;
    auVar28._4_4_ = fVar217 * local_400._4_4_;
    auVar28._0_4_ = fVar206 * (float)local_400;
    auVar28._8_4_ = fVar219 * (float)uStack_3f8;
    auVar28._12_4_ = fVar221 * uStack_3f8._4_4_;
    auVar28._16_4_ = (float)uStack_3f0 * 0.0;
    auVar28._20_4_ = uStack_3f0._4_4_ * 0.0;
    auVar28._24_4_ = (float)uStack_3e8 * 0.0;
    auVar28._28_4_ = auVar278._28_4_;
    auVar29._4_4_ = fVar217 * local_420._4_4_;
    auVar29._0_4_ = fVar206 * (float)local_420;
    auVar29._8_4_ = fVar219 * (float)uStack_418;
    auVar29._12_4_ = fVar221 * uStack_418._4_4_;
    auVar29._16_4_ = (float)uStack_410 * 0.0;
    auVar29._20_4_ = uStack_410._4_4_ * 0.0;
    auVar29._24_4_ = (float)uStack_408 * 0.0;
    auVar29._28_4_ = auVar216._28_4_;
    auVar79._4_4_ = uStack_45c;
    auVar79._0_4_ = local_460;
    auVar79._8_4_ = uStack_458;
    auVar79._12_4_ = uStack_454;
    auVar79._16_4_ = uStack_450;
    auVar79._20_4_ = uStack_44c;
    auVar79._24_4_ = uStack_448;
    auVar79._28_4_ = uStack_444;
    auVar8 = vfmadd231ps_fma(auVar26,auVar25,auVar79);
    auVar113 = vfmadd231ps_fma(auVar27,auVar25,auVar91);
    auVar296 = vfmadd231ps_fma(auVar28,auVar25,auVar90);
    auVar83._8_8_ = uStack_3b8;
    auVar83._0_8_ = local_3c0;
    auVar83._16_8_ = uStack_3b0;
    auVar83._24_8_ = uStack_3a8;
    auVar1 = vfmadd231ps_fma(auVar29,auVar25,auVar83);
    auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar24,auVar89);
    auVar87._8_8_ = uStack_378;
    auVar87._0_8_ = local_380;
    auVar87._16_8_ = uStack_370;
    auVar87._24_8_ = uStack_368;
    auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar24,auVar87);
    auVar85._8_8_ = uStack_398;
    auVar85._0_8_ = local_3a0;
    auVar85._16_8_ = uStack_390;
    auVar85._24_8_ = uStack_388;
    auVar296 = vfmadd231ps_fma(ZEXT1632(auVar296),auVar24,auVar85);
    auVar1 = vfmadd231ps_fma(ZEXT1632(auVar1),auVar92,auVar24);
    auVar81._4_4_ = uStack_43c;
    auVar81._0_4_ = local_440;
    auVar81._8_4_ = uStack_438;
    auVar81._12_4_ = uStack_434;
    auVar81._16_4_ = uStack_430;
    auVar81._20_4_ = uStack_42c;
    auVar81._24_4_ = uStack_428;
    auVar81._28_4_ = uStack_424;
    auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar23,auVar81);
    auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar23,auVar95);
    auVar296 = vfmadd231ps_fma(ZEXT1632(auVar296),auVar23,auVar94);
    auVar1 = vfmadd231ps_fma(ZEXT1632(auVar1),auVar93,auVar23);
    local_ac0._0_4_ = auVar8._0_4_ * fVar222;
    local_ac0._4_4_ = auVar8._4_4_ * fVar222;
    local_ac0._8_4_ = auVar8._8_4_ * fVar222;
    local_ac0._12_4_ = auVar8._12_4_ * fVar222;
    local_ac0._16_4_ = fVar222 * 0.0;
    local_ac0._20_4_ = fVar222 * 0.0;
    local_ac0._24_4_ = fVar222 * 0.0;
    local_ac0._28_4_ = 0;
    fVar206 = auVar113._0_4_ * fVar222;
    fVar217 = auVar113._4_4_ * fVar222;
    local_940._4_4_ = fVar217;
    local_940._0_4_ = fVar206;
    fVar219 = auVar113._8_4_ * fVar222;
    local_940._8_4_ = fVar219;
    fVar221 = auVar113._12_4_ * fVar222;
    local_940._12_4_ = fVar221;
    local_940._16_4_ = fVar222 * 0.0;
    local_940._20_4_ = fVar222 * 0.0;
    local_940._24_4_ = fVar222 * 0.0;
    local_940._28_4_ = (int)((ulong)uStack_1c8 >> 0x20);
    fVar129 = auVar296._0_4_ * fVar222;
    fVar130 = auVar296._4_4_ * fVar222;
    local_720._4_4_ = fVar130;
    local_720._0_4_ = fVar129;
    fVar131 = auVar296._8_4_ * fVar222;
    local_720._8_4_ = fVar131;
    fVar132 = auVar296._12_4_ * fVar222;
    local_720._12_4_ = fVar132;
    fVar133 = fVar222 * 0.0;
    local_720._16_4_ = fVar133;
    fVar163 = fVar222 * 0.0;
    local_720._20_4_ = fVar163;
    fVar184 = fVar222 * 0.0;
    local_720._24_4_ = fVar184;
    local_720._28_4_ = (int)((ulong)uStack_1a8 >> 0x20);
    auVar213._0_4_ = fVar222 * auVar1._0_4_;
    auVar213._4_4_ = fVar222 * auVar1._4_4_;
    auVar213._8_4_ = fVar222 * auVar1._8_4_;
    auVar213._12_4_ = fVar222 * auVar1._12_4_;
    auVar213._16_4_ = fVar222 * 0.0;
    auVar213._20_4_ = fVar222 * 0.0;
    auVar213._24_4_ = fVar222 * 0.0;
    auVar213._28_4_ = 0;
    auVar174 = vpermps_avx2(_DAT_0205d4a0,auVar146);
    local_700 = vpermps_avx2(_DAT_0205d4a0,auVar175);
    local_a20 = vpermps_avx2(_DAT_0205d4a0,auVar284);
    auVar12 = vsubps_avx(auVar174,auVar146);
    auVar120 = vsubps_avx(local_a20,auVar284);
    fVar185 = auVar120._0_4_;
    fVar186 = auVar120._4_4_;
    auVar30._4_4_ = fVar186 * local_ac0._4_4_;
    auVar30._0_4_ = fVar185 * (float)local_ac0._0_4_;
    fVar259 = auVar120._8_4_;
    auVar30._8_4_ = fVar259 * local_ac0._8_4_;
    fVar265 = auVar120._12_4_;
    auVar30._12_4_ = fVar265 * local_ac0._12_4_;
    fVar266 = auVar120._16_4_;
    auVar30._16_4_ = fVar266 * local_ac0._16_4_;
    fVar267 = auVar120._20_4_;
    auVar30._20_4_ = fVar267 * local_ac0._20_4_;
    fVar268 = auVar120._24_4_;
    auVar30._24_4_ = fVar268 * local_ac0._24_4_;
    auVar30._28_4_ = local_a20._28_4_;
    auVar8 = vfmsub231ps_fma(auVar30,local_720,auVar12);
    auVar13 = vsubps_avx(local_700,auVar175);
    fVar297 = auVar12._0_4_;
    fVar300 = auVar12._4_4_;
    auVar31._4_4_ = fVar300 * fVar217;
    auVar31._0_4_ = fVar297 * fVar206;
    fVar301 = auVar12._8_4_;
    auVar31._8_4_ = fVar301 * fVar219;
    fVar302 = auVar12._12_4_;
    auVar31._12_4_ = fVar302 * fVar221;
    fVar303 = auVar12._16_4_;
    auVar31._16_4_ = fVar303 * fVar222 * 0.0;
    fVar304 = auVar12._20_4_;
    auVar31._20_4_ = fVar304 * fVar222 * 0.0;
    fVar305 = auVar12._24_4_;
    auVar31._24_4_ = fVar305 * fVar222 * 0.0;
    auVar31._28_4_ = auVar174._28_4_;
    auVar113 = vfmsub231ps_fma(auVar31,local_ac0,auVar13);
    auVar8 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar113._12_4_ * auVar113._12_4_,
                                                CONCAT48(auVar113._8_4_ * auVar113._8_4_,
                                                         CONCAT44(auVar113._4_4_ * auVar113._4_4_,
                                                                  auVar113._0_4_ * auVar113._0_4_)))
                                     ),ZEXT1632(auVar8),ZEXT1632(auVar8));
    fVar222 = auVar13._0_4_;
    fVar269 = auVar13._4_4_;
    auVar32._4_4_ = fVar269 * fVar130;
    auVar32._0_4_ = fVar222 * fVar129;
    fVar270 = auVar13._8_4_;
    auVar32._8_4_ = fVar270 * fVar131;
    fVar273 = auVar13._12_4_;
    auVar32._12_4_ = fVar273 * fVar132;
    fVar279 = auVar13._16_4_;
    auVar32._16_4_ = fVar279 * fVar133;
    fVar280 = auVar13._20_4_;
    auVar32._20_4_ = fVar280 * fVar163;
    fVar281 = auVar13._24_4_;
    auVar32._24_4_ = fVar281 * fVar184;
    auVar32._28_4_ = 0;
    auVar296 = vfmsub231ps_fma(auVar32,local_940,auVar120);
    auVar239._0_4_ = fVar185 * fVar185;
    auVar239._4_4_ = fVar186 * fVar186;
    auVar239._8_4_ = fVar259 * fVar259;
    auVar239._12_4_ = fVar265 * fVar265;
    auVar239._16_4_ = fVar266 * fVar266;
    auVar239._20_4_ = fVar267 * fVar267;
    auVar239._24_4_ = fVar268 * fVar268;
    auVar239._28_4_ = 0;
    auVar113 = vfmadd231ps_fma(auVar239,auVar13,auVar13);
    auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar12,auVar12);
    auVar122 = vrcpps_avx(ZEXT1632(auVar113));
    auVar296 = vfmadd231ps_fma(ZEXT1632(auVar8),ZEXT1632(auVar296),ZEXT1632(auVar296));
    auVar230._8_4_ = 0x3f800000;
    auVar230._0_8_ = &DAT_3f8000003f800000;
    auVar230._12_4_ = 0x3f800000;
    auVar230._16_4_ = 0x3f800000;
    auVar230._20_4_ = 0x3f800000;
    auVar230._24_4_ = 0x3f800000;
    auVar230._28_4_ = 0x3f800000;
    auVar8 = vfnmadd213ps_fma(auVar122,ZEXT1632(auVar113),auVar230);
    auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar122,auVar122);
    auVar229 = vpermps_avx2(_DAT_0205d4a0,local_ac0);
    auStack_730 = auVar229._16_16_;
    local_980 = vpermps_avx2(_DAT_0205d4a0,local_720);
    auVar33._4_4_ = fVar186 * auVar229._4_4_;
    auVar33._0_4_ = fVar185 * auVar229._0_4_;
    auVar33._8_4_ = fVar259 * auVar229._8_4_;
    auVar33._12_4_ = fVar265 * auVar229._12_4_;
    auVar33._16_4_ = fVar266 * auVar229._16_4_;
    auVar33._20_4_ = fVar267 * auVar229._20_4_;
    auVar33._24_4_ = fVar268 * auVar229._24_4_;
    auVar33._28_4_ = auVar122._28_4_;
    auVar1 = vfmsub231ps_fma(auVar33,local_980,auVar12);
    local_9a0 = vpermps_avx2(_DAT_0205d4a0,local_940);
    auVar34._4_4_ = fVar300 * local_9a0._4_4_;
    auVar34._0_4_ = fVar297 * local_9a0._0_4_;
    auVar34._8_4_ = fVar301 * local_9a0._8_4_;
    auVar34._12_4_ = fVar302 * local_9a0._12_4_;
    auVar34._16_4_ = fVar303 * local_9a0._16_4_;
    auVar34._20_4_ = fVar304 * local_9a0._20_4_;
    auVar34._24_4_ = fVar305 * local_9a0._24_4_;
    auVar34._28_4_ = 0;
    auVar2 = vfmsub231ps_fma(auVar34,auVar229,auVar13);
    auVar1 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar2._12_4_ * auVar2._12_4_,
                                                CONCAT48(auVar2._8_4_ * auVar2._8_4_,
                                                         CONCAT44(auVar2._4_4_ * auVar2._4_4_,
                                                                  auVar2._0_4_ * auVar2._0_4_)))),
                             ZEXT1632(auVar1),ZEXT1632(auVar1));
    fVar217 = local_980._0_4_;
    auVar248._0_4_ = fVar222 * fVar217;
    fVar221 = local_980._4_4_;
    auVar248._4_4_ = fVar269 * fVar221;
    fVar246 = local_980._8_4_;
    auVar248._8_4_ = fVar270 * fVar246;
    fVar247 = local_980._12_4_;
    auVar248._12_4_ = fVar273 * fVar247;
    fVar291 = local_980._16_4_;
    auVar248._16_4_ = fVar279 * fVar291;
    fVar105 = local_980._20_4_;
    auVar248._20_4_ = fVar280 * fVar105;
    fVar128 = local_980._24_4_;
    auVar248._24_4_ = fVar281 * fVar128;
    auVar248._28_4_ = 0;
    auVar2 = vfmsub231ps_fma(auVar248,local_9a0,auVar120);
    auVar1 = vfmadd231ps_fma(ZEXT1632(auVar1),ZEXT1632(auVar2),ZEXT1632(auVar2));
    auVar122 = vmaxps_avx(ZEXT1632(CONCAT412(auVar296._12_4_ * auVar8._12_4_,
                                             CONCAT48(auVar296._8_4_ * auVar8._8_4_,
                                                      CONCAT44(auVar296._4_4_ * auVar8._4_4_,
                                                               auVar296._0_4_ * auVar8._0_4_)))),
                          ZEXT1632(CONCAT412(auVar1._12_4_ * auVar8._12_4_,
                                             CONCAT48(auVar1._8_4_ * auVar8._8_4_,
                                                      CONCAT44(auVar1._4_4_ * auVar8._4_4_,
                                                               auVar1._0_4_ * auVar8._0_4_)))));
    auVar228._0_4_ = auVar213._0_4_ + auVar260._0_4_;
    auVar228._4_4_ = auVar213._4_4_ + auVar260._4_4_;
    auVar228._8_4_ = auVar213._8_4_ + auVar260._8_4_;
    auVar228._12_4_ = auVar213._12_4_ + auVar260._12_4_;
    auVar228._16_4_ = auVar213._16_4_ + 0.0;
    auVar228._20_4_ = auVar213._20_4_ + 0.0;
    auVar228._24_4_ = auVar213._24_4_ + 0.0;
    auVar231._28_4_ = 0;
    auVar231._0_28_ = auVar228;
    local_7c0._28_4_ = 0;
    local_7c0._16_12_ = auVar228._16_12_;
    auVar232 = vsubps_avx(ZEXT1632(auVar260),auVar213);
    local_7e0 = vpermps_avx2(_DAT_0205d4a0,auVar232);
    local_7a0 = ZEXT1632(auVar260);
    auVar237 = vpermps_avx2(_DAT_0205d4a0,local_7a0);
    auVar232 = vmaxps_avx(local_7a0,auVar231);
    auVar10 = vmaxps_avx(local_7e0,auVar237);
    auVar11 = vrsqrtps_avx(ZEXT1632(auVar113));
    auVar10 = vmaxps_avx(auVar232,auVar10);
    uVar101 = auVar232._28_4_;
    fVar206 = auVar11._0_4_;
    fVar219 = auVar11._4_4_;
    fVar106 = auVar11._8_4_;
    fVar218 = auVar11._12_4_;
    fVar257 = auVar11._16_4_;
    fVar220 = auVar11._20_4_;
    fVar258 = auVar11._24_4_;
    auVar35._4_4_ = fVar219 * fVar219 * fVar219 * auVar113._4_4_ * -0.5;
    auVar35._0_4_ = fVar206 * fVar206 * fVar206 * auVar113._0_4_ * -0.5;
    auVar35._8_4_ = fVar106 * fVar106 * fVar106 * auVar113._8_4_ * -0.5;
    auVar35._12_4_ = fVar218 * fVar218 * fVar218 * auVar113._12_4_ * -0.5;
    auVar35._16_4_ = fVar257 * fVar257 * fVar257 * -0.0;
    auVar35._20_4_ = fVar220 * fVar220 * fVar220 * -0.0;
    auVar35._24_4_ = fVar258 * fVar258 * fVar258 * -0.0;
    auVar35._28_4_ = 0;
    auVar147._8_4_ = 0x3fc00000;
    auVar147._0_8_ = 0x3fc000003fc00000;
    auVar147._12_4_ = 0x3fc00000;
    auVar147._16_4_ = 0x3fc00000;
    auVar147._20_4_ = 0x3fc00000;
    auVar147._24_4_ = 0x3fc00000;
    auVar147._28_4_ = 0x3fc00000;
    auVar8 = vfmadd231ps_fma(auVar35,auVar147,auVar11);
    fVar219 = auVar8._0_4_;
    fVar106 = auVar8._4_4_;
    auVar36._4_4_ = fVar269 * fVar106;
    auVar36._0_4_ = fVar222 * fVar219;
    fVar257 = auVar8._8_4_;
    auVar36._8_4_ = fVar270 * fVar257;
    fVar258 = auVar8._12_4_;
    auVar36._12_4_ = fVar273 * fVar258;
    auVar36._16_4_ = fVar279 * 0.0;
    auVar36._20_4_ = fVar280 * 0.0;
    auVar36._24_4_ = fVar281 * 0.0;
    auVar36._28_4_ = uVar101;
    auVar37._4_4_ = (float)local_960._4_4_ * fVar186 * fVar106;
    auVar37._0_4_ = (float)local_960._0_4_ * fVar185 * fVar219;
    auVar37._8_4_ = fStack_958 * fVar259 * fVar257;
    auVar37._12_4_ = fStack_954 * fVar265 * fVar258;
    auVar37._16_4_ = fStack_950 * fVar266 * 0.0;
    auVar37._20_4_ = fStack_94c * fVar267 * 0.0;
    auVar37._24_4_ = fStack_948 * fVar268 * 0.0;
    auVar37._28_4_ = auVar120._28_4_;
    auVar8 = vfmadd231ps_fma(auVar37,auVar36,_local_840);
    auVar290 = ZEXT864(0) << 0x20;
    auVar232 = vsubps_avx(ZEXT832(0) << 0x20,auVar284);
    auVar278 = ZEXT3264(auVar232);
    fVar269 = auVar232._0_4_;
    auVar263._0_4_ = fVar269 * fVar185 * fVar219;
    fVar270 = auVar232._4_4_;
    auVar263._4_4_ = fVar270 * fVar186 * fVar106;
    fVar273 = auVar232._8_4_;
    auVar263._8_4_ = fVar273 * fVar259 * fVar257;
    fVar279 = auVar232._12_4_;
    auVar263._12_4_ = fVar279 * fVar265 * fVar258;
    fVar280 = auVar232._16_4_;
    auVar263._16_4_ = fVar280 * fVar266 * 0.0;
    fVar281 = auVar232._20_4_;
    auVar263._20_4_ = fVar281 * fVar267 * 0.0;
    fVar282 = auVar232._24_4_;
    auVar263._24_4_ = fVar282 * fVar268 * 0.0;
    auVar263._28_4_ = 0;
    auVar11 = vsubps_avx(ZEXT832(0) << 0x20,auVar175);
    auVar260 = vfmadd231ps_fma(auVar263,auVar11,auVar36);
    auVar38._4_4_ = fVar300 * fVar106;
    auVar38._0_4_ = fVar297 * fVar219;
    auVar38._8_4_ = fVar301 * fVar257;
    auVar38._12_4_ = fVar302 * fVar258;
    auVar38._16_4_ = fVar303 * 0.0;
    auVar38._20_4_ = fVar304 * 0.0;
    auVar38._24_4_ = fVar305 * 0.0;
    auVar38._28_4_ = uVar101;
    auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar38,_local_a40);
    auVar272 = ZEXT1664(auVar8);
    auVar243 = ZEXT832(0) << 0x20;
    auVar253 = vsubps_avx(auVar243,auVar146);
    auVar260 = vfmadd231ps_fma(ZEXT1632(auVar260),auVar253,auVar38);
    auVar264 = ZEXT1664(auVar260);
    auVar39._4_4_ = fVar270 * (float)local_960._4_4_;
    auVar39._0_4_ = fVar269 * (float)local_960._0_4_;
    auVar39._8_4_ = fVar273 * fStack_958;
    auVar39._12_4_ = fVar279 * fStack_954;
    auVar39._16_4_ = fVar280 * fStack_950;
    auVar39._20_4_ = fVar281 * fStack_94c;
    auVar39._24_4_ = fVar282 * fStack_948;
    auVar39._28_4_ = uVar101;
    auVar113 = vfmadd231ps_fma(auVar39,_local_840,auVar11);
    auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),_local_a40,auVar253);
    fVar206 = auVar260._0_4_;
    fVar265 = auVar8._0_4_;
    fVar218 = auVar260._4_4_;
    fVar266 = auVar8._4_4_;
    fVar220 = auVar260._8_4_;
    fVar267 = auVar8._8_4_;
    fVar222 = auVar260._12_4_;
    fVar268 = auVar8._12_4_;
    auVar40._28_4_ = local_840._28_4_;
    auVar40._0_28_ =
         ZEXT1628(CONCAT412(fVar268 * fVar222,
                            CONCAT48(fVar267 * fVar220,CONCAT44(fVar266 * fVar218,fVar265 * fVar206)
                                    )));
    auVar145 = vsubps_avx(ZEXT1632(auVar113),auVar40);
    auVar41._4_4_ = fVar270 * fVar270;
    auVar41._0_4_ = fVar269 * fVar269;
    auVar41._8_4_ = fVar273 * fVar273;
    auVar41._12_4_ = fVar279 * fVar279;
    auVar41._16_4_ = fVar280 * fVar280;
    auVar41._20_4_ = fVar281 * fVar281;
    auVar41._24_4_ = fVar282 * fVar282;
    auVar41._28_4_ = local_840._28_4_;
    auVar113 = vfmadd231ps_fma(auVar41,auVar11,auVar11);
    auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar253,auVar253);
    auVar9 = vsubps_avx(ZEXT1632(auVar113),
                        ZEXT1632(CONCAT412(fVar222 * fVar222,
                                           CONCAT48(fVar220 * fVar220,
                                                    CONCAT44(fVar218 * fVar218,fVar206 * fVar206))))
                       );
    auVar232 = vsqrtps_avx(auVar122);
    fVar206 = (auVar232._0_4_ + auVar10._0_4_) * 1.0000002;
    fVar218 = (auVar232._4_4_ + auVar10._4_4_) * 1.0000002;
    fVar220 = (auVar232._8_4_ + auVar10._8_4_) * 1.0000002;
    fVar222 = (auVar232._12_4_ + auVar10._12_4_) * 1.0000002;
    fVar185 = (auVar232._16_4_ + auVar10._16_4_) * 1.0000002;
    fVar186 = (auVar232._20_4_ + auVar10._20_4_) * 1.0000002;
    fVar259 = (auVar232._24_4_ + auVar10._24_4_) * 1.0000002;
    auVar42._4_4_ = fVar218 * fVar218;
    auVar42._0_4_ = fVar206 * fVar206;
    auVar42._8_4_ = fVar220 * fVar220;
    auVar42._12_4_ = fVar222 * fVar222;
    auVar42._16_4_ = fVar185 * fVar185;
    auVar42._20_4_ = fVar186 * fVar186;
    auVar42._24_4_ = fVar259 * fVar259;
    auVar42._28_4_ = auVar232._28_4_ + auVar10._28_4_;
    auVar176._0_4_ = auVar145._0_4_ + auVar145._0_4_;
    auVar176._4_4_ = auVar145._4_4_ + auVar145._4_4_;
    auVar176._8_4_ = auVar145._8_4_ + auVar145._8_4_;
    auVar176._12_4_ = auVar145._12_4_ + auVar145._12_4_;
    auVar176._16_4_ = auVar145._16_4_ + auVar145._16_4_;
    auVar176._20_4_ = auVar145._20_4_ + auVar145._20_4_;
    auVar176._24_4_ = auVar145._24_4_ + auVar145._24_4_;
    auVar176._28_4_ = auVar145._28_4_ + auVar145._28_4_;
    auVar10 = vsubps_avx(auVar9,auVar42);
    auVar245 = ZEXT3264(auVar10);
    auVar262 = ZEXT1632(auVar8);
    auVar43._28_4_ = auVar9._28_4_;
    auVar43._0_28_ =
         ZEXT1628(CONCAT412(fVar268 * fVar268,
                            CONCAT48(fVar267 * fVar267,CONCAT44(fVar266 * fVar266,fVar265 * fVar265)
                                    )));
    local_9c0 = vsubps_avx(local_260,auVar43);
    auVar44._4_4_ = auVar176._4_4_ * auVar176._4_4_;
    auVar44._0_4_ = auVar176._0_4_ * auVar176._0_4_;
    auVar44._8_4_ = auVar176._8_4_ * auVar176._8_4_;
    auVar44._12_4_ = auVar176._12_4_ * auVar176._12_4_;
    auVar44._16_4_ = auVar176._16_4_ * auVar176._16_4_;
    auVar44._20_4_ = auVar176._20_4_ * auVar176._20_4_;
    auVar44._24_4_ = auVar176._24_4_ * auVar176._24_4_;
    auVar44._28_4_ = 0x3f800002;
    fVar218 = local_9c0._0_4_;
    fVar220 = local_9c0._4_4_;
    fVar222 = local_9c0._8_4_;
    fVar185 = local_9c0._12_4_;
    fVar186 = local_9c0._16_4_;
    fVar259 = local_9c0._20_4_;
    fVar265 = local_9c0._24_4_;
    auVar45._4_4_ = fVar220 * 4.0 * auVar10._4_4_;
    auVar45._0_4_ = fVar218 * 4.0 * auVar10._0_4_;
    auVar45._8_4_ = fVar222 * 4.0 * auVar10._8_4_;
    auVar45._12_4_ = fVar185 * 4.0 * auVar10._12_4_;
    auVar45._16_4_ = fVar186 * 4.0 * auVar10._16_4_;
    auVar45._20_4_ = fVar259 * 4.0 * auVar10._20_4_;
    auVar45._24_4_ = fVar265 * 4.0 * auVar10._24_4_;
    auVar45._28_4_ = 0x40800000;
    auVar145 = vsubps_avx(auVar44,auVar45);
    auVar122 = vcmpps_avx(auVar145,auVar243,5);
    auVar261 = ZEXT1632(auVar260);
    fVar206 = local_9c0._28_4_;
    if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar122 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar122 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar122 >> 0x7f,0) == '\0') &&
          (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar122 >> 0xbf,0) == '\0') &&
        (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar122[0x1f])
    {
      fStack_a98 = INFINITY;
      local_aa0 = (undefined1  [8])0x7f8000007f800000;
      fStack_a94 = INFINITY;
      uStack_a90 = 0x7f800000;
      uStack_a8c = 0x7f800000;
      uStack_a88 = 0x7f800000;
      uStack_a84 = 0x7f800000;
      auVar201._8_4_ = 0xff800000;
      auVar201._0_8_ = 0xff800000ff800000;
      auVar201._12_4_ = 0xff800000;
      auVar201._16_4_ = 0xff800000;
      auVar201._20_4_ = 0xff800000;
      auVar201._24_4_ = 0xff800000;
      auVar201._28_4_ = 0xff800000;
    }
    else {
      auVar243 = vcmpps_avx(auVar145,auVar243,5);
      auVar298 = vsqrtps_avx(auVar145);
      auVar292._0_4_ = fVar218 + fVar218;
      auVar292._4_4_ = fVar220 + fVar220;
      auVar292._8_4_ = fVar222 + fVar222;
      auVar292._12_4_ = fVar185 + fVar185;
      auVar292._16_4_ = fVar186 + fVar186;
      auVar292._20_4_ = fVar259 + fVar259;
      auVar292._24_4_ = fVar265 + fVar265;
      auVar292._28_4_ = fVar206 + fVar206;
      auVar145 = vrcpps_avx(auVar292);
      auVar148._8_4_ = 0x3f800000;
      auVar148._0_8_ = &DAT_3f8000003f800000;
      auVar148._12_4_ = 0x3f800000;
      auVar148._16_4_ = 0x3f800000;
      auVar148._20_4_ = 0x3f800000;
      auVar148._24_4_ = 0x3f800000;
      auVar148._28_4_ = 0x3f800000;
      auVar8 = vfnmadd213ps_fma(auVar292,auVar145,auVar148);
      auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar145,auVar145);
      auVar285._0_4_ = (uint)auVar176._0_4_ ^ local_600;
      auVar285._4_4_ = (uint)auVar176._4_4_ ^ uStack_5fc;
      auVar285._8_4_ = (uint)auVar176._8_4_ ^ uStack_5f8;
      auVar285._12_4_ = (uint)auVar176._12_4_ ^ uStack_5f4;
      auVar285._16_4_ = (uint)auVar176._16_4_ ^ (uint)fStack_5f0;
      auVar285._20_4_ = (uint)auVar176._20_4_ ^ (uint)fStack_5ec;
      auVar285._24_4_ = (uint)auVar176._24_4_ ^ (uint)fStack_5e8;
      auVar285._28_4_ = (uint)auVar176._28_4_ ^ uStack_5e4;
      auVar145 = vsubps_avx(auVar285,auVar298);
      auVar46._4_4_ = auVar145._4_4_ * auVar8._4_4_;
      auVar46._0_4_ = auVar145._0_4_ * auVar8._0_4_;
      auVar46._8_4_ = auVar145._8_4_ * auVar8._8_4_;
      auVar46._12_4_ = auVar145._12_4_ * auVar8._12_4_;
      auVar46._16_4_ = auVar145._16_4_ * 0.0;
      auVar46._20_4_ = auVar145._20_4_ * 0.0;
      auVar46._24_4_ = auVar145._24_4_ * 0.0;
      auVar46._28_4_ = auVar145._28_4_;
      auVar145 = vsubps_avx(auVar298,auVar176);
      auVar47._4_4_ = auVar8._4_4_ * auVar145._4_4_;
      auVar47._0_4_ = auVar8._0_4_ * auVar145._0_4_;
      auVar47._8_4_ = auVar8._8_4_ * auVar145._8_4_;
      auVar47._12_4_ = auVar8._12_4_ * auVar145._12_4_;
      auVar47._16_4_ = auVar145._16_4_ * 0.0;
      auVar47._20_4_ = auVar145._20_4_ * 0.0;
      auVar47._24_4_ = auVar145._24_4_ * 0.0;
      auVar47._28_4_ = auVar145._28_4_;
      auVar8 = vfmadd213ps_fma(auVar262,auVar46,auVar261);
      local_4c0 = ZEXT1632(CONCAT412(auVar8._12_4_ * fVar258,
                                     CONCAT48(auVar8._8_4_ * fVar257,
                                              CONCAT44(auVar8._4_4_ * fVar106,auVar8._0_4_ * fVar219
                                                      ))));
      auVar8 = vfmadd213ps_fma(auVar262,auVar47,auVar261);
      local_4e0 = ZEXT1632(CONCAT412(auVar8._12_4_ * fVar258,
                                     CONCAT48(auVar8._8_4_ * fVar257,
                                              CONCAT44(auVar8._4_4_ * fVar106,auVar8._0_4_ * fVar219
                                                      ))));
      auVar149._8_4_ = 0x7f800000;
      auVar149._0_8_ = 0x7f8000007f800000;
      auVar149._12_4_ = 0x7f800000;
      auVar149._16_4_ = 0x7f800000;
      auVar149._20_4_ = 0x7f800000;
      auVar149._24_4_ = 0x7f800000;
      auVar149._28_4_ = 0x7f800000;
      _local_aa0 = vblendvps_avx(auVar149,auVar46,auVar243);
      auVar145 = vandps_avx(local_860,auVar43);
      auVar145 = vmaxps_avx(local_4a0,auVar145);
      auVar48._4_4_ = auVar145._4_4_ * 1.9073486e-06;
      auVar48._0_4_ = auVar145._0_4_ * 1.9073486e-06;
      auVar48._8_4_ = auVar145._8_4_ * 1.9073486e-06;
      auVar48._12_4_ = auVar145._12_4_ * 1.9073486e-06;
      auVar48._16_4_ = auVar145._16_4_ * 1.9073486e-06;
      auVar48._20_4_ = auVar145._20_4_ * 1.9073486e-06;
      auVar48._24_4_ = auVar145._24_4_ * 1.9073486e-06;
      auVar48._28_4_ = auVar145._28_4_;
      auVar290 = ZEXT3264(auVar48);
      auVar145 = vandps_avx(local_9c0,local_860);
      auVar145 = vcmpps_avx(auVar145,auVar48,1);
      auVar150._8_4_ = 0xff800000;
      auVar150._0_8_ = 0xff800000ff800000;
      auVar150._12_4_ = 0xff800000;
      auVar150._16_4_ = 0xff800000;
      auVar150._20_4_ = 0xff800000;
      auVar150._24_4_ = 0xff800000;
      auVar150._28_4_ = 0xff800000;
      auVar201 = vblendvps_avx(auVar150,auVar47,auVar243);
      auVar298 = auVar243 & auVar145;
      if ((((((((auVar298 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar298 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar298 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar298 >> 0x7f,0) != '\0') ||
            (auVar298 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar298 >> 0xbf,0) != '\0') ||
          (auVar298 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar298[0x1f] < '\0') {
        auVar122 = vandps_avx(auVar145,auVar243);
        auVar145 = vcmpps_avx(auVar10,_DAT_02020f00,2);
        auVar245 = ZEXT3264(auVar145);
        auVar162._8_4_ = 0xff800000;
        auVar162._0_8_ = 0xff800000ff800000;
        auVar162._12_4_ = 0xff800000;
        auVar162._16_4_ = 0xff800000;
        auVar162._20_4_ = 0xff800000;
        auVar162._24_4_ = 0xff800000;
        auVar162._28_4_ = 0xff800000;
        auVar182._8_4_ = 0x7f800000;
        auVar182._0_8_ = 0x7f8000007f800000;
        auVar182._12_4_ = 0x7f800000;
        auVar182._16_4_ = 0x7f800000;
        auVar182._20_4_ = 0x7f800000;
        auVar182._24_4_ = 0x7f800000;
        auVar182._28_4_ = 0x7f800000;
        auVar10 = vblendvps_avx(auVar182,auVar162,auVar145);
        auVar8 = vpackssdw_avx(auVar122._0_16_,auVar122._16_16_);
        auVar298 = vpmovsxwd_avx2(auVar8);
        auVar290 = ZEXT3264(auVar298);
        _local_aa0 = vblendvps_avx(_local_aa0,auVar10,auVar298);
        auVar10 = vblendvps_avx(auVar162,auVar182,auVar145);
        auVar201 = vblendvps_avx(auVar201,auVar10,auVar298);
        auVar215._0_8_ = auVar122._0_8_ ^ 0xffffffffffffffff;
        auVar215._8_4_ = auVar122._8_4_ ^ 0xffffffff;
        auVar215._12_4_ = auVar122._12_4_ ^ 0xffffffff;
        auVar215._16_4_ = auVar122._16_4_ ^ 0xffffffff;
        auVar215._20_4_ = auVar122._20_4_ ^ 0xffffffff;
        auVar215._24_4_ = auVar122._24_4_ ^ 0xffffffff;
        auVar215._28_4_ = auVar122._28_4_ ^ 0xffffffff;
        auVar122 = vorps_avx(auVar145,auVar215);
        auVar122 = vandps_avx(auVar243,auVar122);
      }
    }
    auVar10 = local_2a0 & auVar122;
    if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar10 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar10 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar10 >> 0x7f,0) == '\0') &&
          (auVar10 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar10 >> 0xbf,0) == '\0') &&
        (auVar10 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar10[0x1f]) {
LAB_018e390e:
      auVar216 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                     &
                                                  DAT_3f8000003f800000)))))));
    }
    else {
      fVar266 = *(float *)(ray + k * 4 + 0x80) - (float)local_8f0._0_4_;
      auVar242._4_4_ = fVar266;
      auVar242._0_4_ = fVar266;
      auVar242._8_4_ = fVar266;
      auVar242._12_4_ = fVar266;
      auVar242._16_4_ = fVar266;
      auVar242._20_4_ = fVar266;
      auVar242._24_4_ = fVar266;
      auVar242._28_4_ = fVar266;
      auVar145 = vminps_avx(auVar242,auVar201);
      auVar49._4_4_ = fVar130 * fVar270;
      auVar49._0_4_ = fVar129 * fVar269;
      auVar49._8_4_ = fVar131 * fVar273;
      auVar49._12_4_ = fVar132 * fVar279;
      auVar49._16_4_ = fVar133 * fVar280;
      auVar49._20_4_ = fVar163 * fVar281;
      auVar49._24_4_ = fVar184 * fVar282;
      auVar49._28_4_ = fVar266;
      auVar8 = vfmadd213ps_fma(auVar11,local_940,auVar49);
      auVar260 = vfmadd213ps_fma(auVar253,local_ac0,ZEXT1632(auVar8));
      auVar50._4_4_ = (float)local_960._4_4_ * fVar130;
      auVar50._0_4_ = (float)local_960._0_4_ * fVar129;
      auVar50._8_4_ = fStack_958 * fVar131;
      auVar50._12_4_ = fStack_954 * fVar132;
      auVar50._16_4_ = fStack_950 * fVar133;
      auVar50._20_4_ = fStack_94c * fVar163;
      auVar50._24_4_ = fStack_948 * fVar184;
      auVar50._28_4_ = fVar266;
      auVar8 = vfmadd231ps_fma(auVar50,_local_840,local_940);
      auVar113 = vfmadd231ps_fma(ZEXT1632(auVar8),_local_a40,local_ac0);
      auVar10 = vandps_avx(ZEXT1632(auVar113),local_860);
      auVar249._8_4_ = 0x219392ef;
      auVar249._0_8_ = 0x219392ef219392ef;
      auVar249._12_4_ = 0x219392ef;
      auVar249._16_4_ = 0x219392ef;
      auVar249._20_4_ = 0x219392ef;
      auVar249._24_4_ = 0x219392ef;
      auVar249._28_4_ = 0x219392ef;
      auVar11 = vcmpps_avx(auVar10,auVar249,1);
      auVar10 = vrcpps_avx(ZEXT1632(auVar113));
      auVar293._8_4_ = 0x3f800000;
      auVar293._0_8_ = &DAT_3f8000003f800000;
      auVar293._12_4_ = 0x3f800000;
      auVar293._16_4_ = 0x3f800000;
      auVar293._20_4_ = 0x3f800000;
      auVar293._24_4_ = 0x3f800000;
      auVar293._28_4_ = 0x3f800000;
      auVar243 = ZEXT1632(auVar113);
      auVar8 = vfnmadd213ps_fma(auVar10,auVar243,auVar293);
      auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar10,auVar10);
      auVar277._0_4_ = auVar113._0_4_ ^ local_600;
      auVar277._4_4_ = auVar113._4_4_ ^ uStack_5fc;
      auVar277._8_4_ = auVar113._8_4_ ^ uStack_5f8;
      auVar277._12_4_ = auVar113._12_4_ ^ uStack_5f4;
      auVar277._16_4_ = fStack_5f0;
      auVar277._20_4_ = fStack_5ec;
      auVar277._24_4_ = fStack_5e8;
      auVar277._28_4_ = uStack_5e4;
      auVar286._0_4_ = auVar8._0_4_ * (float)(auVar260._0_4_ ^ local_600);
      auVar286._4_4_ = auVar8._4_4_ * (float)(auVar260._4_4_ ^ uStack_5fc);
      auVar286._8_4_ = auVar8._8_4_ * (float)(auVar260._8_4_ ^ uStack_5f8);
      auVar286._12_4_ = auVar8._12_4_ * (float)(auVar260._12_4_ ^ uStack_5f4);
      auVar286._16_4_ = fStack_5f0 * 0.0;
      auVar286._20_4_ = fStack_5ec * 0.0;
      auVar286._24_4_ = fStack_5e8 * 0.0;
      auVar286._28_4_ = 0;
      auVar10 = vcmpps_avx(auVar243,auVar277,1);
      auVar10 = vorps_avx(auVar11,auVar10);
      auVar294._8_4_ = 0xff800000;
      auVar294._0_8_ = 0xff800000ff800000;
      auVar294._12_4_ = 0xff800000;
      auVar294._16_4_ = 0xff800000;
      auVar294._20_4_ = 0xff800000;
      auVar294._24_4_ = 0xff800000;
      auVar294._28_4_ = 0xff800000;
      auVar10 = vblendvps_avx(auVar286,auVar294,auVar10);
      auVar88._4_4_ = fStack_2bc;
      auVar88._0_4_ = local_2c0;
      auVar88._8_4_ = fStack_2b8;
      auVar88._12_4_ = fStack_2b4;
      auVar88._16_4_ = fStack_2b0;
      auVar88._20_4_ = fStack_2ac;
      auVar88._24_4_ = fStack_2a8;
      auVar88._28_4_ = fStack_2a4;
      auVar253 = vmaxps_avx(auVar88,_local_aa0);
      auVar253 = vmaxps_avx(auVar253,auVar10);
      auVar10 = vcmpps_avx(auVar243,auVar277,6);
      auVar10 = vorps_avx(auVar11,auVar10);
      auVar250._8_4_ = 0x7f800000;
      auVar250._0_8_ = 0x7f8000007f800000;
      auVar250._12_4_ = 0x7f800000;
      auVar250._16_4_ = 0x7f800000;
      auVar250._20_4_ = 0x7f800000;
      auVar250._24_4_ = 0x7f800000;
      auVar250._28_4_ = 0x7f800000;
      auVar10 = vblendvps_avx(auVar286,auVar250,auVar10);
      auVar145 = vminps_avx(auVar145,auVar10);
      auVar10 = vsubps_avx(ZEXT832(0) << 0x20,local_700);
      auVar11 = vsubps_avx(ZEXT832(0) << 0x20,local_a20);
      auVar51._4_4_ = auVar11._4_4_ * fVar221;
      auVar51._0_4_ = auVar11._0_4_ * fVar217;
      auVar51._8_4_ = auVar11._8_4_ * fVar246;
      auVar51._12_4_ = auVar11._12_4_ * fVar247;
      auVar51._16_4_ = auVar11._16_4_ * fVar291;
      auVar51._20_4_ = auVar11._20_4_ * fVar105;
      auVar51._24_4_ = auVar11._24_4_ * fVar128;
      auVar51._28_4_ = auVar11._28_4_;
      auVar8 = vfnmsub231ps_fma(auVar51,local_9a0,auVar10);
      auVar10 = vsubps_avx(ZEXT832(0) << 0x20,auVar174);
      auVar260 = vfnmadd231ps_fma(ZEXT1632(auVar8),auVar229,auVar10);
      auVar52._4_4_ = (float)local_960._4_4_ * fVar221;
      auVar52._0_4_ = (float)local_960._0_4_ * fVar217;
      auVar52._8_4_ = fStack_958 * fVar246;
      auVar52._12_4_ = fStack_954 * fVar247;
      auVar52._16_4_ = fStack_950 * fVar291;
      auVar52._20_4_ = fStack_94c * fVar105;
      auVar52._24_4_ = fStack_948 * fVar128;
      auVar52._28_4_ = auVar10._28_4_;
      auVar8 = vfnmsub231ps_fma(auVar52,local_9a0,_local_840);
      auVar113 = vfnmadd231ps_fma(ZEXT1632(auVar8),_local_a40,auVar229);
      auVar245 = ZEXT1664(auVar113);
      auVar117._8_4_ = 0x3f800000;
      auVar117._0_8_ = &DAT_3f8000003f800000;
      auVar117._12_4_ = 0x3f800000;
      auVar117._16_4_ = 0x3f800000;
      auVar117._20_4_ = 0x3f800000;
      auVar117._24_4_ = 0x3f800000;
      auVar117._28_4_ = 0x3f800000;
      auVar10 = vandps_avx(ZEXT1632(auVar113),local_860);
      auVar229 = vrcpps_avx(ZEXT1632(auVar113));
      auVar202._8_4_ = 0x219392ef;
      auVar202._0_8_ = 0x219392ef219392ef;
      auVar202._12_4_ = 0x219392ef;
      auVar202._16_4_ = 0x219392ef;
      auVar202._20_4_ = 0x219392ef;
      auVar202._24_4_ = 0x219392ef;
      auVar202._28_4_ = 0x219392ef;
      auVar11 = vcmpps_avx(auVar10,auVar202,1);
      auVar278 = ZEXT3264(auVar11);
      auVar243 = ZEXT1632(auVar113);
      auVar8 = vfnmadd213ps_fma(auVar229,auVar243,auVar117);
      auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar229,auVar229);
      auVar287._0_4_ = auVar113._0_4_ ^ local_600;
      auVar287._4_4_ = auVar113._4_4_ ^ uStack_5fc;
      auVar287._8_4_ = auVar113._8_4_ ^ uStack_5f8;
      auVar287._12_4_ = auVar113._12_4_ ^ uStack_5f4;
      auVar287._16_4_ = fStack_5f0;
      auVar287._20_4_ = fStack_5ec;
      auVar287._24_4_ = fStack_5e8;
      auVar287._28_4_ = uStack_5e4;
      auVar290 = ZEXT3264(auVar287);
      auVar53._4_4_ = auVar8._4_4_ * (float)(auVar260._4_4_ ^ uStack_5fc);
      auVar53._0_4_ = auVar8._0_4_ * (float)(auVar260._0_4_ ^ local_600);
      auVar53._8_4_ = auVar8._8_4_ * (float)(auVar260._8_4_ ^ uStack_5f8);
      auVar53._12_4_ = auVar8._12_4_ * (float)(auVar260._12_4_ ^ uStack_5f4);
      auVar53._16_4_ = fStack_5f0 * 0.0;
      auVar53._20_4_ = fStack_5ec * 0.0;
      auVar53._24_4_ = fStack_5e8 * 0.0;
      auVar53._28_4_ = uStack_5e4;
      auVar10 = vcmpps_avx(auVar243,auVar287,1);
      auVar10 = vorps_avx(auVar11,auVar10);
      auVar151._8_4_ = 0xff800000;
      auVar151._0_8_ = 0xff800000ff800000;
      auVar151._12_4_ = 0xff800000;
      auVar151._16_4_ = 0xff800000;
      auVar151._20_4_ = 0xff800000;
      auVar151._24_4_ = 0xff800000;
      auVar151._28_4_ = 0xff800000;
      auVar10 = vblendvps_avx(auVar53,auVar151,auVar10);
      _local_820 = vmaxps_avx(auVar253,auVar10);
      auVar10 = vcmpps_avx(auVar243,auVar287,6);
      auVar10 = vorps_avx(auVar11,auVar10);
      auVar203._8_4_ = 0x7f800000;
      auVar203._0_8_ = 0x7f8000007f800000;
      auVar203._12_4_ = 0x7f800000;
      auVar203._16_4_ = 0x7f800000;
      auVar203._20_4_ = 0x7f800000;
      auVar203._24_4_ = 0x7f800000;
      auVar203._28_4_ = 0x7f800000;
      auVar10 = vblendvps_avx(auVar53,auVar203,auVar10);
      auVar122 = vandps_avx(auVar122,local_2a0);
      local_300 = vminps_avx(auVar145,auVar10);
      auVar10 = vcmpps_avx(_local_820,local_300,2);
      auVar11 = auVar122 & auVar10;
      if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar11 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar11 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar11 >> 0x7f,0) == '\0') &&
            (auVar11 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar11 >> 0xbf,0) == '\0') &&
          (auVar11 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar11[0x1f])
      {
        auVar216 = ZEXT3264(auVar117);
      }
      else {
        auVar11 = vminps_avx(local_4c0,auVar117);
        auVar67 = ZEXT412(0);
        auVar290 = ZEXT1264(auVar67) << 0x20;
        auVar11 = vmaxps_avx(auVar11,ZEXT1232(auVar67) << 0x20);
        auVar253 = vminps_avx(local_4e0,auVar117);
        auVar253 = vmaxps_avx(auVar253,ZEXT1232(auVar67) << 0x20);
        auVar55._4_4_ = (auVar11._4_4_ + 1.0) * 0.125;
        auVar55._0_4_ = (auVar11._0_4_ + 0.0) * 0.125;
        auVar55._8_4_ = (auVar11._8_4_ + 2.0) * 0.125;
        auVar55._12_4_ = (auVar11._12_4_ + 3.0) * 0.125;
        auVar55._16_4_ = (auVar11._16_4_ + 4.0) * 0.125;
        auVar55._20_4_ = (auVar11._20_4_ + 5.0) * 0.125;
        auVar55._24_4_ = (auVar11._24_4_ + 6.0) * 0.125;
        auVar55._28_4_ = auVar11._28_4_ + 7.0;
        auVar8 = vfmadd213ps_fma(auVar55,local_780,local_760);
        auVar56._4_4_ = (auVar253._4_4_ + 1.0) * 0.125;
        auVar56._0_4_ = (auVar253._0_4_ + 0.0) * 0.125;
        auVar56._8_4_ = (auVar253._8_4_ + 2.0) * 0.125;
        auVar56._12_4_ = (auVar253._12_4_ + 3.0) * 0.125;
        auVar56._16_4_ = (auVar253._16_4_ + 4.0) * 0.125;
        auVar56._20_4_ = (auVar253._20_4_ + 5.0) * 0.125;
        auVar56._24_4_ = (auVar253._24_4_ + 6.0) * 0.125;
        auVar56._28_4_ = auVar253._28_4_ + 7.0;
        auVar260 = vfmadd213ps_fma(auVar56,local_780,local_760);
        auVar11 = vminps_avx(local_7a0,auVar231);
        auVar253 = vminps_avx(local_7e0,auVar237);
        auVar11 = vminps_avx(auVar11,auVar253);
        auVar232 = vsubps_avx(auVar11,auVar232);
        auVar122 = vandps_avx(auVar10,auVar122);
        local_4c0 = ZEXT1632(auVar8);
        local_4e0 = ZEXT1632(auVar260);
        auVar57._4_4_ = auVar232._4_4_ * 0.99999976;
        auVar57._0_4_ = auVar232._0_4_ * 0.99999976;
        auVar57._8_4_ = auVar232._8_4_ * 0.99999976;
        auVar57._12_4_ = auVar232._12_4_ * 0.99999976;
        auVar57._16_4_ = auVar232._16_4_ * 0.99999976;
        auVar57._20_4_ = auVar232._20_4_ * 0.99999976;
        auVar57._24_4_ = auVar232._24_4_ * 0.99999976;
        auVar57._28_4_ = auVar232._28_4_;
        auVar232 = vmaxps_avx(ZEXT832(0) << 0x20,auVar57);
        auVar58._4_4_ = auVar232._4_4_ * auVar232._4_4_;
        auVar58._0_4_ = auVar232._0_4_ * auVar232._0_4_;
        auVar58._8_4_ = auVar232._8_4_ * auVar232._8_4_;
        auVar58._12_4_ = auVar232._12_4_ * auVar232._12_4_;
        auVar58._16_4_ = auVar232._16_4_ * auVar232._16_4_;
        auVar58._20_4_ = auVar232._20_4_ * auVar232._20_4_;
        auVar58._24_4_ = auVar232._24_4_ * auVar232._24_4_;
        auVar58._28_4_ = auVar232._28_4_;
        auVar10 = vsubps_avx(auVar9,auVar58);
        auVar59._4_4_ = auVar10._4_4_ * fVar220 * 4.0;
        auVar59._0_4_ = auVar10._0_4_ * fVar218 * 4.0;
        auVar59._8_4_ = auVar10._8_4_ * fVar222 * 4.0;
        auVar59._12_4_ = auVar10._12_4_ * fVar185 * 4.0;
        auVar59._16_4_ = auVar10._16_4_ * fVar186 * 4.0;
        auVar59._20_4_ = auVar10._20_4_ * fVar259 * 4.0;
        auVar59._24_4_ = auVar10._24_4_ * fVar265 * 4.0;
        auVar59._28_4_ = auVar232._28_4_;
        auVar11 = vsubps_avx(auVar44,auVar59);
        auVar278 = ZEXT3264(auVar11);
        auVar253 = ZEXT1232(ZEXT812(0)) << 0x20;
        _local_880 = ZEXT1232(ZEXT812(0)) << 0x20;
        local_ae0 = vcmpps_avx(auVar11,ZEXT1232(auVar67) << 0x20,5);
        auVar232 = local_ae0;
        if ((((((((local_ae0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_ae0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_ae0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_ae0 >> 0x7f,0) == '\0') &&
              (local_ae0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_ae0 >> 0xbf,0) == '\0') &&
            (local_ae0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_ae0[0x1f]) {
          auVar120 = ZEXT1232(ZEXT812(0)) << 0x20;
          _local_8c0 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar216 = ZEXT864(0) << 0x20;
          auVar244._8_4_ = 0x7f800000;
          auVar244._0_8_ = 0x7f8000007f800000;
          auVar244._12_4_ = 0x7f800000;
          auVar244._16_4_ = 0x7f800000;
          auVar244._20_4_ = 0x7f800000;
          auVar244._24_4_ = 0x7f800000;
          auVar244._28_4_ = 0x7f800000;
          auVar251._8_4_ = 0xff800000;
          auVar251._0_8_ = 0xff800000ff800000;
          auVar251._12_4_ = 0xff800000;
          auVar251._16_4_ = 0xff800000;
          auVar251._20_4_ = 0xff800000;
          auVar251._24_4_ = 0xff800000;
          auVar251._28_4_ = 0xff800000;
          local_ae0 = auVar174;
          local_8a0 = _local_8c0;
        }
        else {
          auVar145 = vsqrtps_avx(auVar11);
          auVar252._0_4_ = fVar218 + fVar218;
          auVar252._4_4_ = fVar220 + fVar220;
          auVar252._8_4_ = fVar222 + fVar222;
          auVar252._12_4_ = fVar185 + fVar185;
          auVar252._16_4_ = fVar186 + fVar186;
          auVar252._20_4_ = fVar259 + fVar259;
          auVar252._24_4_ = fVar265 + fVar265;
          auVar252._28_4_ = fVar206 + fVar206;
          auVar253 = vrcpps_avx(auVar252);
          auVar121._8_4_ = 0x3f800000;
          auVar121._0_8_ = &DAT_3f8000003f800000;
          auVar121._12_4_ = 0x3f800000;
          auVar121._16_4_ = 0x3f800000;
          auVar121._20_4_ = 0x3f800000;
          auVar121._24_4_ = 0x3f800000;
          auVar121._28_4_ = 0x3f800000;
          auVar8 = vfnmadd213ps_fma(auVar252,auVar253,auVar121);
          auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar253,auVar253);
          auVar288._0_4_ = (uint)auVar176._0_4_ ^ local_600;
          auVar288._4_4_ = (uint)auVar176._4_4_ ^ uStack_5fc;
          auVar288._8_4_ = (uint)auVar176._8_4_ ^ uStack_5f8;
          auVar288._12_4_ = (uint)auVar176._12_4_ ^ uStack_5f4;
          auVar288._16_4_ = (uint)auVar176._16_4_ ^ (uint)fStack_5f0;
          auVar288._20_4_ = (uint)auVar176._20_4_ ^ (uint)fStack_5ec;
          auVar288._24_4_ = (uint)auVar176._24_4_ ^ (uint)fStack_5e8;
          auVar288._28_4_ = (uint)auVar176._28_4_ ^ uStack_5e4;
          auVar253 = vsubps_avx(auVar288,auVar145);
          auVar9 = vsubps_avx(auVar145,auVar176);
          fVar206 = auVar253._0_4_ * auVar8._0_4_;
          fVar217 = auVar253._4_4_ * auVar8._4_4_;
          auVar60._4_4_ = fVar217;
          auVar60._0_4_ = fVar206;
          fVar221 = auVar253._8_4_ * auVar8._8_4_;
          auVar60._8_4_ = fVar221;
          fVar218 = auVar253._12_4_ * auVar8._12_4_;
          auVar60._12_4_ = fVar218;
          fVar246 = auVar253._16_4_ * 0.0;
          auVar60._16_4_ = fVar246;
          fVar220 = auVar253._20_4_ * 0.0;
          auVar60._20_4_ = fVar220;
          fVar247 = auVar253._24_4_ * 0.0;
          auVar60._24_4_ = fVar247;
          auVar60._28_4_ = auVar145._28_4_;
          fVar222 = auVar9._0_4_ * auVar8._0_4_;
          fVar291 = auVar9._4_4_ * auVar8._4_4_;
          auVar61._4_4_ = fVar291;
          auVar61._0_4_ = fVar222;
          fVar105 = auVar9._8_4_ * auVar8._8_4_;
          auVar61._8_4_ = fVar105;
          fVar128 = auVar9._12_4_ * auVar8._12_4_;
          auVar61._12_4_ = fVar128;
          fVar129 = auVar9._16_4_ * 0.0;
          auVar61._16_4_ = fVar129;
          fVar130 = auVar9._20_4_ * 0.0;
          auVar61._20_4_ = fVar130;
          fVar131 = auVar9._24_4_ * 0.0;
          auVar61._24_4_ = fVar131;
          auVar61._28_4_ = auVar253._28_4_;
          auVar290 = ZEXT3264(auVar61);
          auVar8 = vfmadd213ps_fma(auVar262,auVar60,auVar261);
          auVar260 = vfmadd213ps_fma(auVar262,auVar61,auVar261);
          auVar253 = ZEXT1632(CONCAT412(auVar8._12_4_ * fVar258,
                                        CONCAT48(auVar8._8_4_ * fVar257,
                                                 CONCAT44(auVar8._4_4_ * fVar106,
                                                          auVar8._0_4_ * fVar219))));
          auVar145 = ZEXT1632(CONCAT412(auVar260._12_4_ * fVar258,
                                        CONCAT48(auVar260._8_4_ * fVar257,
                                                 CONCAT44(auVar260._4_4_ * fVar106,
                                                          auVar260._0_4_ * fVar219))));
          auVar8 = vfmadd213ps_fma(auVar12,auVar253,auVar146);
          auVar260 = vfmadd213ps_fma(auVar12,auVar145,auVar146);
          auVar113 = vfmadd213ps_fma(auVar13,auVar253,auVar175);
          auVar296 = vfmadd213ps_fma(auVar13,auVar145,auVar175);
          auVar1 = vfmadd213ps_fma(auVar253,auVar120,auVar284);
          auVar2 = vfmadd213ps_fma(auVar120,auVar145,auVar284);
          auVar62._4_4_ = (float)local_a40._4_4_ * fVar217;
          auVar62._0_4_ = (float)local_a40._0_4_ * fVar206;
          auVar62._8_4_ = fStack_a38 * fVar221;
          auVar62._12_4_ = fStack_a34 * fVar218;
          auVar62._16_4_ = fStack_a30 * fVar246;
          auVar62._20_4_ = fStack_a2c * fVar220;
          auVar62._24_4_ = fStack_a28 * fVar247;
          auVar62._28_4_ = 0;
          auVar120 = vsubps_avx(auVar62,ZEXT1632(auVar8));
          auVar153._0_4_ = (float)local_840._0_4_ * fVar206;
          auVar153._4_4_ = (float)local_840._4_4_ * fVar217;
          auVar153._8_4_ = fStack_838 * fVar221;
          auVar153._12_4_ = fStack_834 * fVar218;
          auVar153._16_4_ = fStack_830 * fVar246;
          auVar153._20_4_ = fStack_82c * fVar220;
          auVar153._24_4_ = fStack_828 * fVar247;
          auVar153._28_4_ = 0;
          auVar253 = vsubps_avx(auVar153,ZEXT1632(auVar113));
          auVar178._0_4_ = (float)local_960._0_4_ * fVar206;
          auVar178._4_4_ = (float)local_960._4_4_ * fVar217;
          auVar178._8_4_ = fStack_958 * fVar221;
          auVar178._12_4_ = fStack_954 * fVar218;
          auVar178._16_4_ = fStack_950 * fVar246;
          auVar178._20_4_ = fStack_94c * fVar220;
          auVar178._24_4_ = fStack_948 * fVar247;
          auVar178._28_4_ = 0;
          auVar12 = vsubps_avx(auVar178,ZEXT1632(auVar1));
          auVar216 = ZEXT3264(auVar12);
          auVar254._0_4_ = (float)local_a40._0_4_ * fVar222;
          auVar254._4_4_ = (float)local_a40._4_4_ * fVar291;
          auVar254._8_4_ = fStack_a38 * fVar105;
          auVar254._12_4_ = fStack_a34 * fVar128;
          auVar254._16_4_ = fStack_a30 * fVar129;
          auVar254._20_4_ = fStack_a2c * fVar130;
          auVar254._24_4_ = fStack_a28 * fVar131;
          auVar254._28_4_ = 0;
          _local_880 = vsubps_avx(auVar254,ZEXT1632(auVar260));
          auVar63._4_4_ = fVar291 * (float)local_840._4_4_;
          auVar63._0_4_ = fVar222 * (float)local_840._0_4_;
          auVar63._8_4_ = fVar105 * fStack_838;
          auVar63._12_4_ = fVar128 * fStack_834;
          auVar63._16_4_ = fVar129 * fStack_830;
          auVar63._20_4_ = fVar130 * fStack_82c;
          auVar63._24_4_ = fVar131 * fStack_828;
          auVar63._28_4_ = local_880._28_4_;
          local_8a0 = vsubps_avx(auVar63,ZEXT1632(auVar296));
          auVar64._4_4_ = (float)local_960._4_4_ * fVar291;
          auVar64._0_4_ = (float)local_960._0_4_ * fVar222;
          auVar64._8_4_ = fStack_958 * fVar105;
          auVar64._12_4_ = fStack_954 * fVar128;
          auVar64._16_4_ = fStack_950 * fVar129;
          auVar64._20_4_ = fStack_94c * fVar130;
          auVar64._24_4_ = fStack_948 * fVar131;
          auVar64._28_4_ = local_8a0._28_4_;
          _local_8c0 = vsubps_avx(auVar64,ZEXT1632(auVar2));
          auVar12 = vcmpps_avx(auVar11,_DAT_02020f00,5);
          auVar255._8_4_ = 0x7f800000;
          auVar255._0_8_ = 0x7f8000007f800000;
          auVar255._12_4_ = 0x7f800000;
          auVar255._16_4_ = 0x7f800000;
          auVar255._20_4_ = 0x7f800000;
          auVar255._24_4_ = 0x7f800000;
          auVar255._28_4_ = 0x7f800000;
          auVar244 = vblendvps_avx(auVar255,auVar60,auVar12);
          auVar11 = vandps_avx(local_860,auVar43);
          auVar11 = vmaxps_avx(local_4a0,auVar11);
          auVar278 = ZEXT3264(CONCAT428(0x36000000,
                                        CONCAT424(0x36000000,
                                                  CONCAT420(0x36000000,
                                                            CONCAT416(0x36000000,
                                                                      CONCAT412(0x36000000,
                                                                                CONCAT48(0x36000000,
                                                                                                                                                                                  
                                                  0x3600000036000000)))))));
          auVar65._4_4_ = auVar11._4_4_ * 1.9073486e-06;
          auVar65._0_4_ = auVar11._0_4_ * 1.9073486e-06;
          auVar65._8_4_ = auVar11._8_4_ * 1.9073486e-06;
          auVar65._12_4_ = auVar11._12_4_ * 1.9073486e-06;
          auVar65._16_4_ = auVar11._16_4_ * 1.9073486e-06;
          auVar65._20_4_ = auVar11._20_4_ * 1.9073486e-06;
          auVar65._24_4_ = auVar11._24_4_ * 1.9073486e-06;
          auVar65._28_4_ = auVar11._28_4_;
          auVar11 = vandps_avx(local_9c0,local_860);
          auVar11 = vcmpps_avx(auVar11,auVar65,1);
          auVar272 = ZEXT3264(auVar11);
          auVar256._8_4_ = 0xff800000;
          auVar256._0_8_ = 0xff800000ff800000;
          auVar256._12_4_ = 0xff800000;
          auVar256._16_4_ = 0xff800000;
          auVar256._20_4_ = 0xff800000;
          auVar256._24_4_ = 0xff800000;
          auVar256._28_4_ = 0xff800000;
          auVar251 = vblendvps_avx(auVar256,auVar61,auVar12);
          auVar13 = auVar12 & auVar11;
          _local_aa0 = auVar122;
          if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar13 >> 0x7f,0) != '\0') ||
                (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar13 >> 0xbf,0) != '\0') ||
              (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar13[0x1f] < '\0') {
            auVar232 = vandps_avx(auVar11,auVar12);
            auVar11 = vcmpps_avx(auVar10,ZEXT832(0) << 0x20,2);
            auVar289._8_4_ = 0xff800000;
            auVar289._0_8_ = 0xff800000ff800000;
            auVar289._12_4_ = 0xff800000;
            auVar289._16_4_ = 0xff800000;
            auVar289._20_4_ = 0xff800000;
            auVar289._24_4_ = 0xff800000;
            auVar289._28_4_ = 0xff800000;
            auVar290 = ZEXT3264(auVar289);
            auVar295._8_4_ = 0x7f800000;
            auVar295._0_8_ = 0x7f8000007f800000;
            auVar295._12_4_ = 0x7f800000;
            auVar295._16_4_ = 0x7f800000;
            auVar295._20_4_ = 0x7f800000;
            auVar295._24_4_ = 0x7f800000;
            auVar295._28_4_ = 0x7f800000;
            auVar10 = vblendvps_avx(auVar295,auVar289,auVar11);
            auVar8 = vpackssdw_avx(auVar232._0_16_,auVar232._16_16_);
            auVar13 = vpmovsxwd_avx2(auVar8);
            auVar272 = ZEXT3264(auVar13);
            auVar244 = vblendvps_avx(auVar244,auVar10,auVar13);
            auVar10 = vblendvps_avx(auVar289,auVar295,auVar11);
            auVar278 = ZEXT3264(auVar10);
            auVar251 = vblendvps_avx(auVar251,auVar10,auVar13);
            auVar233._0_8_ = auVar232._0_8_ ^ 0xffffffffffffffff;
            auVar233._8_4_ = auVar232._8_4_ ^ 0xffffffff;
            auVar233._12_4_ = auVar232._12_4_ ^ 0xffffffff;
            auVar233._16_4_ = auVar232._16_4_ ^ 0xffffffff;
            auVar233._20_4_ = auVar232._20_4_ ^ 0xffffffff;
            auVar233._24_4_ = auVar232._24_4_ ^ 0xffffffff;
            auVar233._28_4_ = auVar232._28_4_ ^ 0xffffffff;
            auVar232 = vorps_avx(auVar11,auVar233);
            auVar232 = vandps_avx(auVar12,auVar232);
          }
        }
        auVar264 = ZEXT3264(_local_820);
        local_360 = _local_820;
        local_340 = vminps_avx(local_300,auVar244);
        _local_540 = vmaxps_avx(_local_820,auVar251);
        auVar245 = ZEXT3264(_local_540);
        _local_320 = _local_540;
        auVar10 = vcmpps_avx(_local_820,local_340,2);
        local_500 = vandps_avx(auVar10,auVar122);
        auVar10 = vcmpps_avx(_local_540,local_300,2);
        local_5e0 = vandps_avx(auVar10,auVar122);
        auVar122 = vorps_avx(local_5e0,local_500);
        if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar122 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar122 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar122 >> 0x7f,0) == '\0') &&
              (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar122 >> 0xbf,0) == '\0') &&
            (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar122[0x1f]) goto LAB_018e390e;
        local_580._0_8_ = auVar232._0_8_ ^ 0xffffffffffffffff;
        local_580._8_4_ = auVar232._8_4_ ^ 0xffffffff;
        local_580._12_4_ = auVar232._12_4_ ^ 0xffffffff;
        local_580._16_4_ = auVar232._16_4_ ^ 0xffffffff;
        local_580._20_4_ = auVar232._20_4_ ^ 0xffffffff;
        local_580._24_4_ = auVar232._24_4_ ^ 0xffffffff;
        local_580._28_4_ = auVar232._28_4_ ^ 0xffffffff;
        auVar183._0_4_ = (float)local_960._0_4_ * auVar216._0_4_;
        auVar183._4_4_ = (float)local_960._4_4_ * auVar216._4_4_;
        auVar183._8_4_ = fStack_958 * auVar216._8_4_;
        auVar183._12_4_ = fStack_954 * auVar216._12_4_;
        auVar183._16_4_ = fStack_950 * auVar216._16_4_;
        auVar183._20_4_ = fStack_94c * auVar216._20_4_;
        auVar183._28_36_ = auVar216._28_36_;
        auVar183._24_4_ = fStack_948 * auVar216._24_4_;
        auVar8 = vfmadd132ps_fma(auVar253,auVar183._0_32_,_local_840);
        auVar8 = vfmadd213ps_fma(auVar120,_local_a40,ZEXT1632(auVar8));
        auVar122 = vandps_avx(ZEXT1632(auVar8),local_860);
        auVar154._8_4_ = 0x3e99999a;
        auVar154._0_8_ = 0x3e99999a3e99999a;
        auVar154._12_4_ = 0x3e99999a;
        auVar154._16_4_ = 0x3e99999a;
        auVar154._20_4_ = 0x3e99999a;
        auVar154._24_4_ = 0x3e99999a;
        auVar154._28_4_ = 0x3e99999a;
        auVar122 = vcmpps_avx(auVar122,auVar154,1);
        auVar122 = vorps_avx(auVar122,local_580);
        auVar155._8_4_ = 3;
        auVar155._0_8_ = 0x300000003;
        auVar155._12_4_ = 3;
        auVar155._16_4_ = 3;
        auVar155._20_4_ = 3;
        auVar155._24_4_ = 3;
        auVar155._28_4_ = 3;
        auVar179._8_4_ = 2;
        auVar179._0_8_ = 0x200000002;
        auVar179._12_4_ = 2;
        auVar179._16_4_ = 2;
        auVar179._20_4_ = 2;
        auVar179._24_4_ = 2;
        auVar179._28_4_ = 2;
        auVar122 = vblendvps_avx(auVar179,auVar155,auVar122);
        uVar101 = (undefined4)uVar102;
        local_5a0._4_4_ = uVar101;
        local_5a0._0_4_ = uVar101;
        local_5a0._8_4_ = uVar101;
        local_5a0._12_4_ = uVar101;
        local_5a0._16_4_ = uVar101;
        local_5a0._20_4_ = uVar101;
        local_5a0._24_4_ = uVar101;
        local_5a0._28_4_ = uVar101;
        local_520 = vpcmpgtd_avx2(auVar122,local_5a0);
        local_5c0 = vpandn_avx2(local_520,local_500);
        auVar216 = ZEXT3264(local_5c0);
        auVar122 = local_500 & ~local_520;
        auStack_618 = auVar237._8_24_;
        local_620 = uVar102;
        fVar206 = (float)local_960._0_4_;
        fVar217 = (float)local_960._4_4_;
        fVar219 = fStack_958;
        fVar221 = fStack_954;
        fVar106 = fStack_950;
        fVar218 = fStack_94c;
        fVar246 = fStack_948;
        local_560 = local_5e0;
        if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar122 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar122 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar122 >> 0x7f,0) != '\0') ||
              (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar122 >> 0xbf,0) != '\0') ||
            (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar122[0x1f] < '\0') {
          auVar260 = vminps_avx(local_a50,local_a70);
          auVar8 = vmaxps_avx(local_a50,local_a70);
          auVar113 = vminps_avx(local_a60,_local_a80);
          auVar296 = vminps_avx(auVar260,auVar113);
          auVar260 = vmaxps_avx(local_a60,_local_a80);
          auVar113 = vmaxps_avx(auVar8,auVar260);
          local_740._8_4_ = 0x7fffffff;
          local_740._0_8_ = 0x7fffffff7fffffff;
          local_740._12_4_ = 0x7fffffff;
          auVar8 = vandps_avx(auVar296,local_740);
          auVar260 = vandps_avx(auVar113,local_740);
          auVar8 = vmaxps_avx(auVar8,auVar260);
          auVar260 = vmovshdup_avx(auVar8);
          auVar260 = vmaxss_avx(auVar260,auVar8);
          auVar8 = vshufpd_avx(auVar8,auVar8,1);
          auVar8 = vmaxss_avx(auVar8,auVar260);
          local_9c0._0_4_ = auVar8._0_4_ * 1.9073486e-06;
          local_7c0._0_16_ = vshufps_avx(auVar113,auVar113,0xff);
          local_7c0._28_4_ = 0;
          local_800._4_4_ = (float)local_820._4_4_ + fVar127;
          local_800._0_4_ = (float)local_820._0_4_ + fVar127;
          fStack_7f8 = fStack_818 + fVar127;
          fStack_7f4 = fStack_814 + fVar127;
          fStack_7f0 = fStack_810 + fVar127;
          fStack_7ec = fStack_80c + fVar127;
          fStack_7e8 = fStack_808 + fVar127;
          fStack_7e4 = fStack_804 + fVar127;
          do {
            auVar156._8_4_ = 0x7f800000;
            auVar156._0_8_ = 0x7f8000007f800000;
            auVar156._12_4_ = 0x7f800000;
            auVar156._16_4_ = 0x7f800000;
            auVar156._20_4_ = 0x7f800000;
            auVar156._24_4_ = 0x7f800000;
            auVar156._28_4_ = 0x7f800000;
            auVar122 = auVar216._0_32_;
            auVar232 = vblendvps_avx(auVar156,_local_820,auVar122);
            auVar10 = vshufps_avx(auVar232,auVar232,0xb1);
            auVar10 = vminps_avx(auVar232,auVar10);
            auVar11 = vshufpd_avx(auVar10,auVar10,5);
            auVar10 = vminps_avx(auVar10,auVar11);
            auVar11 = vpermpd_avx2(auVar10,0x4e);
            auVar10 = vminps_avx(auVar10,auVar11);
            auVar232 = vcmpps_avx(auVar232,auVar10,0);
            auVar10 = auVar122 & auVar232;
            if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar10 >> 0x7f,0) != '\0') ||
                  (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar10 >> 0xbf,0) != '\0') ||
                (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar10[0x1f] < '\0') {
              auVar122 = vandps_avx(auVar232,auVar122);
            }
            local_7e0._0_8_ = uVar100;
            uVar96 = vmovmskps_avx(auVar122);
            iVar14 = 0;
            for (; (uVar96 & 1) == 0; uVar96 = uVar96 >> 1 | 0x80000000) {
              iVar14 = iVar14 + 1;
            }
            uVar97 = iVar14 << 2;
            *(undefined4 *)(local_5c0 + uVar97) = 0;
            uVar96 = *(uint *)(local_4c0 + uVar97);
            uVar97 = *(uint *)(local_360 + uVar97);
            fVar206 = local_ae4;
            if ((float)local_910._0_4_ < 0.0) {
              fVar206 = sqrtf((float)local_910._0_4_);
            }
            auVar290 = ZEXT464(uVar97);
            auVar264 = ZEXT464(uVar96);
            local_720._0_4_ = fVar206 * 1.9073486e-06;
            lVar99 = 5;
            do {
              fVar220 = auVar264._0_4_;
              fVar218 = 1.0 - fVar220;
              local_ae0._0_16_ = ZEXT416((uint)fVar218);
              fVar221 = fVar218 * fVar218 * fVar218;
              fVar106 = fVar220 * fVar220;
              fVar219 = fVar220 * fVar106;
              auVar260 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar221),
                                         ZEXT416((uint)fVar219));
              fVar206 = fVar220 * fVar218;
              auVar113 = vfmadd231ss_fma(ZEXT416((uint)(fVar220 * fVar206 * 6.0)),
                                         ZEXT416((uint)(fVar218 * fVar206)),
                                         SUB6416(ZEXT464(0x41400000),0));
              auVar296 = vfmadd231ss_fma(ZEXT416((uint)(fVar218 * fVar206 * 6.0)),
                                         SUB6416(ZEXT464(0x41400000),0),
                                         ZEXT416((uint)(fVar220 * fVar206)));
              auVar8 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar219),
                                       ZEXT416((uint)fVar221));
              fVar217 = (auVar8._0_4_ + auVar296._0_4_) * 0.16666667;
              fVar219 = fVar219 * 0.16666667;
              auVar134._0_4_ = fVar219 * (float)local_a80._0_4_;
              auVar134._4_4_ = fVar219 * (float)local_a80._4_4_;
              auVar134._8_4_ = fVar219 * fStack_a78;
              auVar134._12_4_ = fVar219 * fStack_a74;
              auVar187._4_4_ = fVar217;
              auVar187._0_4_ = fVar217;
              auVar187._8_4_ = fVar217;
              auVar187._12_4_ = fVar217;
              auVar8 = vfmadd132ps_fma(auVar187,auVar134,local_a60);
              fVar217 = (auVar260._0_4_ + auVar113._0_4_) * 0.16666667;
              auVar135._4_4_ = fVar217;
              auVar135._0_4_ = fVar217;
              auVar135._8_4_ = fVar217;
              auVar135._12_4_ = fVar217;
              auVar8 = vfmadd132ps_fma(auVar135,auVar8,local_a70);
              fVar257 = auVar290._0_4_;
              auVar164._4_4_ = fVar257;
              auVar164._0_4_ = fVar257;
              auVar164._8_4_ = fVar257;
              auVar164._12_4_ = fVar257;
              auVar260 = vfmadd213ps_fma(auVar164,local_900,_DAT_01feba10);
              fVar221 = fVar221 * 0.16666667;
              auVar108._4_4_ = fVar221;
              auVar108._0_4_ = fVar221;
              auVar108._8_4_ = fVar221;
              auVar108._12_4_ = fVar221;
              auVar8 = vfmadd132ps_fma(auVar108,auVar8,local_a50);
              local_700._0_16_ = auVar8;
              auVar8 = vsubps_avx(auVar260,auVar8);
              _local_aa0 = auVar8;
              auVar8 = vdpps_avx(auVar8,auVar8,0x7f);
              fVar247 = auVar8._0_4_;
              auVar260 = auVar264._0_16_;
              if (fVar247 < 0.0) {
                local_ae0._0_16_ = ZEXT416((uint)fVar218);
                local_a20._0_4_ = fVar106;
                local_ac0._0_4_ = fVar206;
                auVar264._0_4_ = sqrtf(fVar247);
                auVar264._4_60_ = extraout_var;
                auVar113 = auVar264._0_16_;
                fVar206 = (float)local_ac0._0_4_;
                fVar106 = (float)local_a20._0_4_;
              }
              else {
                auVar113 = vsqrtss_avx(auVar8,auVar8);
              }
              auVar272 = ZEXT1664(auVar290._0_16_);
              fVar217 = local_ae0._0_4_;
              auVar109._4_4_ = fVar217;
              auVar109._0_4_ = fVar217;
              auVar109._8_4_ = fVar217;
              auVar109._12_4_ = fVar217;
              auVar1 = vfnmsub213ss_fma(auVar260,auVar260,ZEXT416((uint)(fVar206 * 4.0)));
              auVar296 = vfmadd231ss_fma(ZEXT416((uint)(fVar206 * 4.0)),local_ae0._0_16_,
                                         local_ae0._0_16_);
              fVar206 = fVar217 * -fVar217 * 0.5;
              fVar217 = auVar1._0_4_ * 0.5;
              fVar219 = auVar296._0_4_ * 0.5;
              fVar106 = fVar106 * 0.5;
              auVar224._0_4_ = (float)local_a80._0_4_ * fVar106;
              auVar224._4_4_ = (float)local_a80._4_4_ * fVar106;
              auVar224._8_4_ = fStack_a78 * fVar106;
              auVar224._12_4_ = fStack_a74 * fVar106;
              auVar188._4_4_ = fVar219;
              auVar188._0_4_ = fVar219;
              auVar188._8_4_ = fVar219;
              auVar188._12_4_ = fVar219;
              auVar296 = vfmadd213ps_fma(auVar188,local_a60,auVar224);
              auVar207._4_4_ = fVar217;
              auVar207._0_4_ = fVar217;
              auVar207._8_4_ = fVar217;
              auVar207._12_4_ = fVar217;
              auVar296 = vfmadd213ps_fma(auVar207,local_a70,auVar296);
              auVar275._4_4_ = fVar206;
              auVar275._0_4_ = fVar206;
              auVar275._8_4_ = fVar206;
              auVar275._12_4_ = fVar206;
              auVar2 = vfmadd213ps_fma(auVar275,local_a50,auVar296);
              auVar296 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_ae0._0_16_,auVar260);
              auVar260 = vfmadd231ss_fma(local_ae0._0_16_,auVar260,SUB6416(ZEXT464(0xc0000000),0));
              auVar189._0_4_ = (float)local_a80._0_4_ * fVar220;
              auVar189._4_4_ = (float)local_a80._4_4_ * fVar220;
              auVar189._8_4_ = fStack_a78 * fVar220;
              auVar189._12_4_ = fStack_a74 * fVar220;
              uVar101 = auVar260._0_4_;
              auVar208._4_4_ = uVar101;
              auVar208._0_4_ = uVar101;
              auVar208._8_4_ = uVar101;
              auVar208._12_4_ = uVar101;
              auVar260 = vfmadd213ps_fma(auVar208,local_a60,auVar189);
              auVar165._0_4_ = auVar296._0_4_;
              auVar165._4_4_ = auVar165._0_4_;
              auVar165._8_4_ = auVar165._0_4_;
              auVar165._12_4_ = auVar165._0_4_;
              auVar260 = vfmadd213ps_fma(auVar165,local_a70,auVar260);
              auVar141 = vfmadd231ps_fma(auVar260,local_a50,auVar109);
              auVar296 = vdpps_avx(auVar2,auVar2,0x7f);
              auVar260 = vblendps_avx(auVar296,_DAT_01feba10,0xe);
              auVar1 = vrsqrtss_avx(auVar260,auVar260);
              fVar206 = auVar1._0_4_;
              fVar219 = auVar296._0_4_;
              fVar206 = fVar206 * 1.5 + fVar219 * -0.5 * fVar206 * fVar206 * fVar206;
              auVar1 = vdpps_avx(auVar2,auVar141,0x7f);
              auVar166._0_4_ = auVar141._0_4_ * fVar219;
              auVar166._4_4_ = auVar141._4_4_ * fVar219;
              auVar166._8_4_ = auVar141._8_4_ * fVar219;
              auVar166._12_4_ = auVar141._12_4_ * fVar219;
              fVar217 = auVar1._0_4_;
              auVar225._0_4_ = auVar2._0_4_ * fVar217;
              auVar225._4_4_ = auVar2._4_4_ * fVar217;
              fVar221 = auVar2._8_4_;
              auVar225._8_4_ = fVar221 * fVar217;
              fVar106 = auVar2._12_4_;
              auVar225._12_4_ = fVar106 * fVar217;
              auVar1 = vsubps_avx(auVar166,auVar225);
              auVar260 = vrcpss_avx(auVar260,auVar260);
              auVar141 = vfnmadd213ss_fma(auVar260,auVar296,ZEXT416(0x40000000));
              fVar217 = auVar260._0_4_ * auVar141._0_4_;
              auVar260 = vmaxss_avx(ZEXT416((uint)local_9c0._0_4_),
                                    ZEXT416((uint)(fVar257 * (float)local_720._0_4_)));
              auVar216 = ZEXT1664(auVar260);
              local_940._0_8_ = auVar2._0_8_ ^ 0x8000000080000000;
              local_940._8_4_ = -fVar221;
              local_940._12_4_ = -fVar106;
              auVar190._0_4_ = fVar206 * auVar1._0_4_ * fVar217;
              auVar190._4_4_ = fVar206 * auVar1._4_4_ * fVar217;
              auVar190._8_4_ = fVar206 * auVar1._8_4_ * fVar217;
              auVar190._12_4_ = fVar206 * auVar1._12_4_ * fVar217;
              auVar240._0_4_ = auVar2._0_4_ * fVar206;
              auVar240._4_4_ = auVar2._4_4_ * fVar206;
              auVar240._8_4_ = fVar221 * fVar206;
              auVar240._12_4_ = fVar106 * fVar206;
              local_ae0._0_16_ = auVar2;
              local_a20._0_4_ = auVar260._0_4_;
              if (fVar219 < -fVar219) {
                local_ac0._0_4_ = auVar113._0_4_;
                local_980._0_16_ = auVar240;
                local_9a0._0_16_ = auVar190;
                auVar272 = ZEXT1664(auVar290._0_16_);
                fVar206 = sqrtf(fVar219);
                auVar216 = ZEXT464((uint)local_a20._0_4_);
                auVar113 = ZEXT416((uint)local_ac0._0_4_);
                auVar190 = local_9a0._0_16_;
                auVar240 = local_980._0_16_;
              }
              else {
                auVar260 = vsqrtss_avx(auVar296,auVar296);
                fVar206 = auVar260._0_4_;
              }
              auVar260 = vdpps_avx(_local_aa0,auVar240,0x7f);
              auVar2 = vfmadd213ss_fma(ZEXT416((uint)local_9c0._0_4_),auVar113,auVar216._0_16_);
              auVar296 = vdpps_avx(local_940._0_16_,auVar240,0x7f);
              auVar1 = vdpps_avx(_local_aa0,auVar190,0x7f);
              local_ac0._0_16_ = vdpps_avx(local_900,auVar240,0x7f);
              auVar2 = vfmadd213ss_fma(ZEXT416((uint)(auVar113._0_4_ + 1.0)),
                                       ZEXT416((uint)((float)local_9c0._0_4_ / fVar206)),auVar2);
              fVar206 = auVar296._0_4_ + auVar1._0_4_;
              auVar110._0_4_ = auVar260._0_4_ * auVar260._0_4_;
              auVar110._4_4_ = auVar260._4_4_ * auVar260._4_4_;
              auVar110._8_4_ = auVar260._8_4_ * auVar260._8_4_;
              auVar110._12_4_ = auVar260._12_4_ * auVar260._12_4_;
              auVar113 = vdpps_avx(_local_aa0,local_940._0_16_,0x7f);
              auVar1 = vsubps_avx(auVar8,auVar110);
              auVar296 = vrsqrtss_avx(auVar1,auVar1);
              fVar219 = auVar1._0_4_;
              fVar217 = auVar296._0_4_;
              fVar217 = fVar217 * 1.5 + fVar219 * -0.5 * fVar217 * fVar217 * fVar217;
              auVar296 = vdpps_avx(_local_aa0,local_900,0x7f);
              local_940._0_16_ = vfnmadd231ss_fma(auVar113,auVar260,ZEXT416((uint)fVar206));
              auVar113 = vfnmadd231ss_fma(auVar296,auVar260,local_ac0._0_16_);
              if (fVar219 < 0.0) {
                local_980._0_16_ = auVar260;
                local_9a0._0_4_ = auVar2._0_4_;
                local_760._0_16_ = ZEXT416((uint)fVar206);
                local_780._0_4_ = fVar217;
                local_7a0._0_16_ = auVar113;
                auVar272 = ZEXT1664(auVar272._0_16_);
                fVar219 = sqrtf(fVar219);
                auVar216 = ZEXT464((uint)local_a20._0_4_);
                fVar217 = (float)local_780._0_4_;
                auVar113 = local_7a0._0_16_;
                auVar260 = local_980._0_16_;
                auVar296 = local_760._0_16_;
                fVar258 = (float)local_9a0._0_4_;
              }
              else {
                auVar296 = vsqrtss_avx(auVar1,auVar1);
                fVar219 = auVar296._0_4_;
                auVar296 = ZEXT416((uint)fVar206);
                fVar258 = auVar2._0_4_;
              }
              auVar278 = ZEXT1664(auVar260);
              auVar1 = vpermilps_avx(local_700._0_16_,0xff);
              auVar2 = vshufps_avx(local_ae0._0_16_,local_ae0._0_16_,0xff);
              auVar141 = vfmsub213ss_fma(local_940._0_16_,ZEXT416((uint)fVar217),auVar2);
              auVar191._0_8_ = local_ac0._0_8_ ^ 0x8000000080000000;
              auVar191._8_4_ = local_ac0._8_4_ ^ 0x80000000;
              auVar191._12_4_ = local_ac0._12_4_ ^ 0x80000000;
              auVar209._0_8_ = auVar141._0_8_ ^ 0x8000000080000000;
              auVar209._8_4_ = auVar141._8_4_ ^ 0x80000000;
              auVar209._12_4_ = auVar141._12_4_ ^ 0x80000000;
              auVar113 = ZEXT416((uint)(auVar113._0_4_ * fVar217));
              auVar141 = vfmsub231ss_fma(ZEXT416((uint)(auVar141._0_4_ * local_ac0._0_4_)),auVar296,
                                         auVar113);
              auVar113 = vinsertps_avx(auVar113,auVar191,0x10);
              uVar101 = auVar141._0_4_;
              auVar192._4_4_ = uVar101;
              auVar192._0_4_ = uVar101;
              auVar192._8_4_ = uVar101;
              auVar192._12_4_ = uVar101;
              auVar113 = vdivps_avx(auVar113,auVar192);
              auVar141 = ZEXT416((uint)(fVar219 - auVar1._0_4_));
              auVar1 = vinsertps_avx(auVar260,auVar141,0x10);
              auVar167._0_4_ = auVar1._0_4_ * auVar113._0_4_;
              auVar167._4_4_ = auVar1._4_4_ * auVar113._4_4_;
              auVar167._8_4_ = auVar1._8_4_ * auVar113._8_4_;
              auVar167._12_4_ = auVar1._12_4_ * auVar113._12_4_;
              auVar113 = vinsertps_avx(auVar209,auVar296,0x1c);
              auVar113 = vdivps_avx(auVar113,auVar192);
              auVar296 = vhaddps_avx(auVar167,auVar167);
              auVar193._0_4_ = auVar1._0_4_ * auVar113._0_4_;
              auVar193._4_4_ = auVar1._4_4_ * auVar113._4_4_;
              auVar193._8_4_ = auVar1._8_4_ * auVar113._8_4_;
              auVar193._12_4_ = auVar1._12_4_ * auVar113._12_4_;
              auVar113 = vhaddps_avx(auVar193,auVar193);
              fVar220 = fVar220 - auVar296._0_4_;
              auVar264 = ZEXT464((uint)fVar220);
              fVar257 = fVar257 - auVar113._0_4_;
              auVar245 = ZEXT464((uint)fVar257);
              auVar260 = vandps_avx(auVar260,local_740);
              bVar54 = true;
              fVar206 = (float)local_960._0_4_;
              fVar217 = (float)local_960._4_4_;
              fVar219 = fStack_958;
              fVar221 = fStack_954;
              fVar106 = fStack_950;
              fVar218 = fStack_94c;
              fVar246 = fStack_948;
              if (fVar258 <= auVar260._0_4_) {
                auVar290 = ZEXT1664(ZEXT416((uint)fVar257));
              }
              else {
                auVar113 = vfmadd231ss_fma(ZEXT416((uint)(auVar216._0_4_ + fVar258)),
                                           local_7c0._0_16_,ZEXT416(0x36000000));
                auVar260 = vandps_avx(auVar141,local_740);
                if (auVar113._0_4_ <= auVar260._0_4_) {
                  auVar290 = ZEXT1664(ZEXT416((uint)fVar257));
                }
                else {
                  fVar257 = fVar257 + (float)local_8f0._0_4_;
                  auVar245 = ZEXT464((uint)fVar257);
                  auVar260 = ZEXT416((uint)fVar257);
                  if (fVar104 <= fVar257) {
                    fVar258 = *(float *)(ray + k * 4 + 0x80);
                    auVar278 = ZEXT464((uint)fVar258);
                    auVar290 = ZEXT1664(auVar260);
                    if (((fVar257 <= fVar258) && (0.0 <= fVar220)) && (fVar220 <= 1.0)) {
                      auVar8 = vrsqrtss_avx(auVar8,auVar8);
                      fVar222 = auVar8._0_4_;
                      pGVar6 = (context->scene->geometries).items[local_af0].ptr;
                      if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                        unaff_BL = 0;
                      }
                      else {
                        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                           (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                          fVar247 = fVar222 * 1.5 + fVar247 * -0.5 * fVar222 * fVar222 * fVar222;
                          auVar136._0_4_ = fVar247 * (float)local_aa0._0_4_;
                          auVar136._4_4_ = fVar247 * (float)local_aa0._4_4_;
                          auVar136._8_4_ = fVar247 * fStack_a98;
                          auVar136._12_4_ = fVar247 * fStack_a94;
                          auVar1 = vfmadd213ps_fma(auVar2,auVar136,local_ae0._0_16_);
                          auVar8 = vshufps_avx(auVar136,auVar136,0xc9);
                          auVar113 = vshufps_avx(local_ae0._0_16_,local_ae0._0_16_,0xc9);
                          auVar137._0_4_ = auVar136._0_4_ * auVar113._0_4_;
                          auVar137._4_4_ = auVar136._4_4_ * auVar113._4_4_;
                          auVar137._8_4_ = auVar136._8_4_ * auVar113._8_4_;
                          auVar137._12_4_ = auVar136._12_4_ * auVar113._12_4_;
                          auVar296 = vfmsub231ps_fma(auVar137,local_ae0._0_16_,auVar8);
                          auVar8 = vshufps_avx(auVar296,auVar296,0xc9);
                          auVar113 = vshufps_avx(auVar1,auVar1,0xc9);
                          auVar296 = vshufps_avx(auVar296,auVar296,0xd2);
                          auVar111._0_4_ = auVar1._0_4_ * auVar296._0_4_;
                          auVar111._4_4_ = auVar1._4_4_ * auVar296._4_4_;
                          auVar111._8_4_ = auVar1._8_4_ * auVar296._8_4_;
                          auVar111._12_4_ = auVar1._12_4_ * auVar296._12_4_;
                          auVar8 = vfmsub231ps_fma(auVar111,auVar8,auVar113);
                          local_6c0 = (RTCHitN  [16])vshufps_avx(auVar8,auVar8,0x55);
                          auStack_6b0 = vshufps_avx(auVar8,auVar8,0xaa);
                          local_6a0 = auVar8._0_4_;
                          local_680 = ZEXT416(0) << 0x20;
                          local_670 = CONCAT44(uStack_6dc,local_6e0);
                          uStack_668 = CONCAT44(uStack_6d4,uStack_6d8);
                          local_660._4_4_ = uStack_6cc;
                          local_660._0_4_ = local_6d0;
                          local_660._8_4_ = uStack_6c8;
                          local_660._12_4_ = uStack_6c4;
                          vpcmpeqd_avx2(ZEXT1632(local_660),ZEXT1632(local_660));
                          uStack_64c = context->user->instID[0];
                          local_650 = uStack_64c;
                          uStack_648 = uStack_64c;
                          uStack_644 = uStack_64c;
                          uStack_640 = context->user->instPrimID[0];
                          uStack_63c = uStack_640;
                          uStack_638 = uStack_640;
                          uStack_634 = uStack_640;
                          *(float *)(ray + k * 4 + 0x80) = fVar257;
                          local_b00 = *local_9f8;
                          uStack_af8 = local_9f8[1];
                          local_9f0.valid = (int *)&local_b00;
                          local_9f0.geometryUserPtr = pGVar6->userPtr;
                          local_9f0.context = context->user;
                          local_9f0.hit = local_6c0;
                          local_9f0.N = 4;
                          local_9f0.ray = (RTCRayN *)ray;
                          uStack_69c = local_6a0;
                          uStack_698 = local_6a0;
                          uStack_694 = local_6a0;
                          local_690 = fVar220;
                          fStack_68c = fVar220;
                          fStack_688 = fVar220;
                          fStack_684 = fVar220;
                          if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            auVar245 = ZEXT1664(auVar260);
                            auVar272 = ZEXT1664(auVar272._0_16_);
                            (*pGVar6->occlusionFilterN)(&local_9f0);
                            auVar264 = ZEXT1664(ZEXT416((uint)fVar220));
                            fVar206 = (float)local_960._0_4_;
                            fVar217 = (float)local_960._4_4_;
                            fVar219 = fStack_958;
                            fVar221 = fStack_954;
                            fVar106 = fStack_950;
                            fVar218 = fStack_94c;
                            fVar246 = fStack_948;
                          }
                          auVar74._8_8_ = uStack_af8;
                          auVar74._0_8_ = local_b00;
                          if (auVar74 == (undefined1  [16])0x0) {
                            auVar8 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                            auVar8 = auVar8 ^ _DAT_01febe20;
                          }
                          else {
                            p_Var7 = context->args->filter;
                            if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar245 = ZEXT1664(auVar245._0_16_);
                              auVar272 = ZEXT1664(auVar272._0_16_);
                              (*p_Var7)(&local_9f0);
                              auVar264 = ZEXT1664(ZEXT416((uint)fVar220));
                              fVar206 = (float)local_960._0_4_;
                              fVar217 = (float)local_960._4_4_;
                              fVar219 = fStack_958;
                              fVar221 = fStack_954;
                              fVar106 = fStack_950;
                              fVar218 = fStack_94c;
                              fVar246 = fStack_948;
                            }
                            auVar75._8_8_ = uStack_af8;
                            auVar75._0_8_ = local_b00;
                            auVar113 = vpcmpeqd_avx((undefined1  [16])0x0,auVar75);
                            auVar8 = auVar113 ^ _DAT_01febe20;
                            auVar168._8_4_ = 0xff800000;
                            auVar168._0_8_ = 0xff800000ff800000;
                            auVar168._12_4_ = 0xff800000;
                            auVar113 = vblendvps_avx(auVar168,*(undefined1 (*) [16])
                                                               (local_9f0.ray + 0x80),auVar113);
                            *(undefined1 (*) [16])(local_9f0.ray + 0x80) = auVar113;
                          }
                          auVar290 = ZEXT1664(auVar260);
                          auVar278 = ZEXT464((uint)fVar258);
                          auVar138._8_8_ = 0x100000001;
                          auVar138._0_8_ = 0x100000001;
                          unaff_BL = (auVar138 & auVar8) != (undefined1  [16])0x0;
                          if (!(bool)unaff_BL) {
                            *(float *)(ray + k * 4 + 0x80) = fVar258;
                          }
                          bVar54 = false;
                          goto LAB_018e47ba;
                        }
                        unaff_BL = 1;
                      }
                      bVar54 = false;
                      goto LAB_018e47ba;
                    }
                  }
                  bVar54 = false;
                  auVar290 = ZEXT1664(auVar260);
                  unaff_BL = 0;
                }
              }
LAB_018e47ba:
              if (!bVar54) goto LAB_018e4afc;
              lVar99 = lVar99 + -1;
            } while (lVar99 != 0);
            unaff_BL = 0;
            fVar206 = (float)local_960._0_4_;
            fVar217 = (float)local_960._4_4_;
            fVar219 = fStack_958;
            fVar221 = fStack_954;
            fVar106 = fStack_950;
            fVar218 = fStack_94c;
            fVar246 = fStack_948;
LAB_018e4afc:
            unaff_BL = unaff_BL & 1;
            uVar100 = CONCAT71(local_7e0._1_7_,local_7e0[0] | unaff_BL);
            uVar101 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar123._4_4_ = uVar101;
            auVar123._0_4_ = uVar101;
            auVar123._8_4_ = uVar101;
            auVar123._12_4_ = uVar101;
            auVar123._16_4_ = uVar101;
            auVar123._20_4_ = uVar101;
            auVar123._24_4_ = uVar101;
            auVar123._28_4_ = uVar101;
            auVar232 = vcmpps_avx(_local_800,auVar123,2);
            auVar122 = vandps_avx(auVar232,local_5c0);
            auVar216 = ZEXT3264(auVar122);
            auVar232 = local_5c0 & auVar232;
            uVar102 = local_620;
            local_5c0 = auVar122;
          } while ((((((((auVar232 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar232 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar232 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar232 >> 0x7f,0) != '\0') ||
                     (auVar232 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar232 >> 0xbf,0) != '\0') ||
                   (auVar232 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar232[0x1f] < '\0');
        }
        auVar126._0_4_ = fVar206 * (float)local_8c0._0_4_;
        auVar126._4_4_ = fVar217 * (float)local_8c0._4_4_;
        auVar126._8_4_ = fVar219 * fStack_8b8;
        auVar126._12_4_ = fVar221 * fStack_8b4;
        auVar126._16_4_ = fVar106 * fStack_8b0;
        auVar126._20_4_ = fVar218 * fStack_8ac;
        auVar126._28_36_ = auVar216._28_36_;
        auVar126._24_4_ = fVar246 * fStack_8a8;
        auVar8 = vfmadd132ps_fma(local_8a0,auVar126._0_32_,_local_840);
        auVar8 = vfmadd213ps_fma(_local_880,_local_a40,ZEXT1632(auVar8));
        auVar122 = vandps_avx(ZEXT1632(auVar8),local_860);
        auVar157._8_4_ = 0x3e99999a;
        auVar157._0_8_ = 0x3e99999a3e99999a;
        auVar157._12_4_ = 0x3e99999a;
        auVar157._16_4_ = 0x3e99999a;
        auVar157._20_4_ = 0x3e99999a;
        auVar157._24_4_ = 0x3e99999a;
        auVar157._28_4_ = 0x3e99999a;
        auVar122 = vcmpps_avx(auVar122,auVar157,1);
        auVar232 = vorps_avx(auVar122,local_580);
        auVar158._0_4_ = fVar127 + (float)local_540._0_4_;
        auVar158._4_4_ = fVar127 + (float)local_540._4_4_;
        auVar158._8_4_ = fVar127 + fStack_538;
        auVar158._12_4_ = fVar127 + fStack_534;
        auVar158._16_4_ = fVar127 + fStack_530;
        auVar158._20_4_ = fVar127 + fStack_52c;
        auVar158._24_4_ = fVar127 + fStack_528;
        auVar158._28_4_ = fVar127 + fStack_524;
        uVar101 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar180._4_4_ = uVar101;
        auVar180._0_4_ = uVar101;
        auVar180._8_4_ = uVar101;
        auVar180._12_4_ = uVar101;
        auVar180._16_4_ = uVar101;
        auVar180._20_4_ = uVar101;
        auVar180._24_4_ = uVar101;
        auVar180._28_4_ = uVar101;
        auVar122 = vcmpps_avx(auVar158,auVar180,2);
        local_8a0 = vandps_avx(auVar122,local_560);
        auVar159._8_4_ = 3;
        auVar159._0_8_ = 0x300000003;
        auVar159._12_4_ = 3;
        auVar159._16_4_ = 3;
        auVar159._20_4_ = 3;
        auVar159._24_4_ = 3;
        auVar159._28_4_ = 3;
        auVar181._8_4_ = 2;
        auVar181._0_8_ = 0x200000002;
        auVar181._12_4_ = 2;
        auVar181._16_4_ = 2;
        auVar181._20_4_ = 2;
        auVar181._24_4_ = 2;
        auVar181._28_4_ = 2;
        auVar122 = vblendvps_avx(auVar181,auVar159,auVar232);
        _local_8c0 = vpcmpgtd_avx2(auVar122,local_5a0);
        auVar122 = vpandn_avx2(_local_8c0,local_8a0);
        auVar232 = local_8a0 & ~_local_8c0;
        if ((((((((auVar232 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar232 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar232 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar232 >> 0x7f,0) != '\0') ||
              (auVar232 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar232 >> 0xbf,0) != '\0') ||
            (auVar232 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar232[0x1f] < '\0') {
          auVar260 = vminps_avx(local_a50,local_a70);
          auVar8 = vmaxps_avx(local_a50,local_a70);
          auVar113 = vminps_avx(local_a60,_local_a80);
          auVar296 = vminps_avx(auVar260,auVar113);
          auVar260 = vmaxps_avx(local_a60,_local_a80);
          auVar113 = vmaxps_avx(auVar8,auVar260);
          local_740._8_4_ = 0x7fffffff;
          local_740._0_8_ = 0x7fffffff7fffffff;
          local_740._12_4_ = 0x7fffffff;
          auVar8 = vandps_avx(auVar296,local_740);
          auVar260 = vandps_avx(auVar113,local_740);
          auVar8 = vmaxps_avx(auVar8,auVar260);
          auVar260 = vmovshdup_avx(auVar8);
          auVar260 = vmaxss_avx(auVar260,auVar8);
          auVar8 = vshufpd_avx(auVar8,auVar8,1);
          auVar8 = vmaxss_avx(auVar8,auVar260);
          local_9c0._0_4_ = auVar8._0_4_ * 1.9073486e-06;
          local_7c0._0_16_ = vshufps_avx(auVar113,auVar113,0xff);
          _local_800 = _local_320;
          local_880._4_4_ = fVar127 + (float)local_320._4_4_;
          local_880._0_4_ = fVar127 + (float)local_320._0_4_;
          fStack_878 = fVar127 + fStack_318;
          fStack_874 = fVar127 + fStack_314;
          fStack_870 = fVar127 + fStack_310;
          fStack_86c = fVar127 + fStack_30c;
          fStack_868 = fVar127 + fStack_308;
          fStack_864 = fVar127 + fStack_304;
          do {
            auVar160._8_4_ = 0x7f800000;
            auVar160._0_8_ = 0x7f8000007f800000;
            auVar160._12_4_ = 0x7f800000;
            auVar160._16_4_ = 0x7f800000;
            auVar160._20_4_ = 0x7f800000;
            auVar160._24_4_ = 0x7f800000;
            auVar160._28_4_ = 0x7f800000;
            auVar232 = vblendvps_avx(auVar160,_local_800,auVar122);
            auVar10 = vshufps_avx(auVar232,auVar232,0xb1);
            auVar10 = vminps_avx(auVar232,auVar10);
            auVar11 = vshufpd_avx(auVar10,auVar10,5);
            auVar10 = vminps_avx(auVar10,auVar11);
            auVar11 = vpermpd_avx2(auVar10,0x4e);
            auVar10 = vminps_avx(auVar10,auVar11);
            auVar10 = vcmpps_avx(auVar232,auVar10,0);
            auVar11 = auVar122 & auVar10;
            auVar232 = auVar122;
            if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar11 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar11 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar11 >> 0x7f,0) != '\0') ||
                  (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar11 >> 0xbf,0) != '\0') ||
                (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar11[0x1f] < '\0') {
              auVar232 = vandps_avx(auVar10,auVar122);
            }
            local_7e0._0_8_ = uVar100;
            uVar96 = vmovmskps_avx(auVar232);
            iVar14 = 0;
            for (; (uVar96 & 1) == 0; uVar96 = uVar96 >> 1 | 0x80000000) {
              iVar14 = iVar14 + 1;
            }
            uVar97 = iVar14 << 2;
            local_5e0 = auVar122;
            *(undefined4 *)(local_5e0 + uVar97) = 0;
            uVar96 = *(uint *)(local_4e0 + uVar97);
            uVar97 = *(uint *)(local_300 + uVar97);
            fVar206 = local_ae8;
            if ((float)local_910._0_4_ < 0.0) {
              fVar206 = sqrtf((float)local_910._0_4_);
            }
            auVar272 = ZEXT464(uVar97);
            auVar264 = ZEXT464(uVar96);
            local_720._0_4_ = fVar206 * 1.9073486e-06;
            lVar99 = 5;
            do {
              fVar246 = auVar264._0_4_;
              fVar218 = 1.0 - fVar246;
              local_ae0._0_16_ = ZEXT416((uint)fVar218);
              fVar221 = fVar218 * fVar218 * fVar218;
              fVar106 = fVar246 * fVar246;
              fVar219 = fVar246 * fVar106;
              auVar260 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar221),
                                         ZEXT416((uint)fVar219));
              fVar217 = fVar246 * fVar218;
              auVar113 = vfmadd231ss_fma(ZEXT416((uint)(fVar246 * fVar217 * 6.0)),
                                         ZEXT416((uint)(fVar218 * fVar217)),
                                         SUB6416(ZEXT464(0x41400000),0));
              auVar296 = vfmadd231ss_fma(ZEXT416((uint)(fVar218 * fVar217 * 6.0)),
                                         SUB6416(ZEXT464(0x41400000),0),
                                         ZEXT416((uint)(fVar246 * fVar217)));
              auVar8 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar219),
                                       ZEXT416((uint)fVar221));
              fVar206 = (auVar8._0_4_ + auVar296._0_4_) * 0.16666667;
              fVar219 = fVar219 * 0.16666667;
              auVar139._0_4_ = fVar219 * (float)local_a80._0_4_;
              auVar139._4_4_ = fVar219 * (float)local_a80._4_4_;
              auVar139._8_4_ = fVar219 * fStack_a78;
              auVar139._12_4_ = fVar219 * fStack_a74;
              auVar194._4_4_ = fVar206;
              auVar194._0_4_ = fVar206;
              auVar194._8_4_ = fVar206;
              auVar194._12_4_ = fVar206;
              auVar8 = vfmadd132ps_fma(auVar194,auVar139,local_a60);
              fVar206 = (auVar260._0_4_ + auVar113._0_4_) * 0.16666667;
              auVar140._4_4_ = fVar206;
              auVar140._0_4_ = fVar206;
              auVar140._8_4_ = fVar206;
              auVar140._12_4_ = fVar206;
              auVar8 = vfmadd132ps_fma(auVar140,auVar8,local_a70);
              fVar206 = auVar272._0_4_;
              auVar169._4_4_ = fVar206;
              auVar169._0_4_ = fVar206;
              auVar169._8_4_ = fVar206;
              auVar169._12_4_ = fVar206;
              auVar260 = vfmadd213ps_fma(auVar169,local_900,_DAT_01feba10);
              fVar221 = fVar221 * 0.16666667;
              auVar112._4_4_ = fVar221;
              auVar112._0_4_ = fVar221;
              auVar112._8_4_ = fVar221;
              auVar112._12_4_ = fVar221;
              auVar8 = vfmadd132ps_fma(auVar112,auVar8,local_a50);
              local_700._0_16_ = auVar8;
              auVar8 = vsubps_avx(auVar260,auVar8);
              _local_aa0 = auVar8;
              auVar8 = vdpps_avx(auVar8,auVar8,0x7f);
              fVar219 = auVar8._0_4_;
              auVar260 = auVar264._0_16_;
              if (fVar219 < 0.0) {
                local_ae0._0_16_ = ZEXT416((uint)fVar218);
                local_a20._0_4_ = fVar106;
                local_ac0._0_4_ = fVar217;
                auVar272._0_4_ = sqrtf(fVar219);
                auVar272._4_60_ = extraout_var_00;
                auVar113 = auVar272._0_16_;
                fVar217 = (float)local_ac0._0_4_;
                fVar106 = (float)local_a20._0_4_;
              }
              else {
                auVar113 = vsqrtss_avx(auVar8,auVar8);
              }
              fVar221 = local_ae0._0_4_;
              auVar114._4_4_ = fVar221;
              auVar114._0_4_ = fVar221;
              auVar114._8_4_ = fVar221;
              auVar114._12_4_ = fVar221;
              auVar1 = vfnmsub213ss_fma(auVar260,auVar260,ZEXT416((uint)(fVar217 * 4.0)));
              auVar296 = vfmadd231ss_fma(ZEXT416((uint)(fVar217 * 4.0)),local_ae0._0_16_,
                                         local_ae0._0_16_);
              fVar217 = fVar221 * -fVar221 * 0.5;
              fVar221 = auVar1._0_4_ * 0.5;
              fVar218 = auVar296._0_4_ * 0.5;
              fVar106 = fVar106 * 0.5;
              auVar226._0_4_ = (float)local_a80._0_4_ * fVar106;
              auVar226._4_4_ = (float)local_a80._4_4_ * fVar106;
              auVar226._8_4_ = fStack_a78 * fVar106;
              auVar226._12_4_ = fStack_a74 * fVar106;
              auVar195._4_4_ = fVar218;
              auVar195._0_4_ = fVar218;
              auVar195._8_4_ = fVar218;
              auVar195._12_4_ = fVar218;
              auVar296 = vfmadd213ps_fma(auVar195,local_a60,auVar226);
              auVar210._4_4_ = fVar221;
              auVar210._0_4_ = fVar221;
              auVar210._8_4_ = fVar221;
              auVar210._12_4_ = fVar221;
              auVar296 = vfmadd213ps_fma(auVar210,local_a70,auVar296);
              auVar276._4_4_ = fVar217;
              auVar276._0_4_ = fVar217;
              auVar276._8_4_ = fVar217;
              auVar276._12_4_ = fVar217;
              auVar2 = vfmadd213ps_fma(auVar276,local_a50,auVar296);
              auVar296 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_ae0._0_16_,auVar260);
              auVar260 = vfmadd231ss_fma(local_ae0._0_16_,auVar260,SUB6416(ZEXT464(0xc0000000),0));
              auVar196._0_4_ = (float)local_a80._0_4_ * fVar246;
              auVar196._4_4_ = (float)local_a80._4_4_ * fVar246;
              auVar196._8_4_ = fStack_a78 * fVar246;
              auVar196._12_4_ = fStack_a74 * fVar246;
              uVar101 = auVar260._0_4_;
              auVar211._4_4_ = uVar101;
              auVar211._0_4_ = uVar101;
              auVar211._8_4_ = uVar101;
              auVar211._12_4_ = uVar101;
              auVar260 = vfmadd213ps_fma(auVar211,local_a60,auVar196);
              auVar170._0_4_ = auVar296._0_4_;
              auVar170._4_4_ = auVar170._0_4_;
              auVar170._8_4_ = auVar170._0_4_;
              auVar170._12_4_ = auVar170._0_4_;
              auVar260 = vfmadd213ps_fma(auVar170,local_a70,auVar260);
              auVar141 = vfmadd231ps_fma(auVar260,local_a50,auVar114);
              auVar296 = vdpps_avx(auVar2,auVar2,0x7f);
              auVar260 = vblendps_avx(auVar296,_DAT_01feba10,0xe);
              auVar1 = vrsqrtss_avx(auVar260,auVar260);
              fVar217 = auVar1._0_4_;
              fVar106 = auVar296._0_4_;
              fVar217 = fVar217 * 1.5 + fVar106 * -0.5 * fVar217 * fVar217 * fVar217;
              auVar1 = vdpps_avx(auVar2,auVar141,0x7f);
              auVar171._0_4_ = auVar141._0_4_ * fVar106;
              auVar171._4_4_ = auVar141._4_4_ * fVar106;
              auVar171._8_4_ = auVar141._8_4_ * fVar106;
              auVar171._12_4_ = auVar141._12_4_ * fVar106;
              fVar221 = auVar1._0_4_;
              auVar227._0_4_ = auVar2._0_4_ * fVar221;
              auVar227._4_4_ = auVar2._4_4_ * fVar221;
              fVar218 = auVar2._8_4_;
              auVar227._8_4_ = fVar218 * fVar221;
              fVar257 = auVar2._12_4_;
              auVar227._12_4_ = fVar257 * fVar221;
              auVar1 = vsubps_avx(auVar171,auVar227);
              auVar260 = vrcpss_avx(auVar260,auVar260);
              auVar141 = vfnmadd213ss_fma(auVar260,auVar296,ZEXT416(0x40000000));
              fVar221 = auVar260._0_4_ * auVar141._0_4_;
              auVar260 = vmaxss_avx(ZEXT416((uint)local_9c0._0_4_),
                                    ZEXT416((uint)(fVar206 * (float)local_720._0_4_)));
              auVar216 = ZEXT1664(auVar260);
              local_940._0_8_ = auVar2._0_8_ ^ 0x8000000080000000;
              local_940._8_4_ = -fVar218;
              local_940._12_4_ = -fVar257;
              auVar197._0_4_ = fVar217 * auVar1._0_4_ * fVar221;
              auVar197._4_4_ = fVar217 * auVar1._4_4_ * fVar221;
              auVar197._8_4_ = fVar217 * auVar1._8_4_ * fVar221;
              auVar197._12_4_ = fVar217 * auVar1._12_4_ * fVar221;
              auVar241._0_4_ = auVar2._0_4_ * fVar217;
              auVar241._4_4_ = auVar2._4_4_ * fVar217;
              auVar241._8_4_ = fVar218 * fVar217;
              auVar241._12_4_ = fVar257 * fVar217;
              local_ae0._0_16_ = auVar2;
              local_a20._0_4_ = auVar260._0_4_;
              if (fVar106 < -fVar106) {
                local_ac0._0_4_ = auVar113._0_4_;
                local_980._0_16_ = auVar241;
                local_9a0._0_16_ = auVar197;
                fVar217 = sqrtf(fVar106);
                auVar216 = ZEXT464((uint)local_a20._0_4_);
                auVar113 = ZEXT416((uint)local_ac0._0_4_);
                auVar197 = local_9a0._0_16_;
                auVar241 = local_980._0_16_;
              }
              else {
                auVar260 = vsqrtss_avx(auVar296,auVar296);
                fVar217 = auVar260._0_4_;
              }
              auVar260 = vdpps_avx(_local_aa0,auVar241,0x7f);
              auVar2 = vfmadd213ss_fma(ZEXT416((uint)local_9c0._0_4_),auVar113,auVar216._0_16_);
              auVar296 = vdpps_avx(local_940._0_16_,auVar241,0x7f);
              auVar1 = vdpps_avx(_local_aa0,auVar197,0x7f);
              local_ac0._0_16_ = vdpps_avx(local_900,auVar241,0x7f);
              auVar2 = vfmadd213ss_fma(ZEXT416((uint)(auVar113._0_4_ + 1.0)),
                                       ZEXT416((uint)((float)local_9c0._0_4_ / fVar217)),auVar2);
              auVar290 = ZEXT1664(auVar2);
              fVar217 = auVar296._0_4_ + auVar1._0_4_;
              auVar115._0_4_ = auVar260._0_4_ * auVar260._0_4_;
              auVar115._4_4_ = auVar260._4_4_ * auVar260._4_4_;
              auVar115._8_4_ = auVar260._8_4_ * auVar260._8_4_;
              auVar115._12_4_ = auVar260._12_4_ * auVar260._12_4_;
              auVar113 = vdpps_avx(_local_aa0,local_940._0_16_,0x7f);
              auVar1 = vsubps_avx(auVar8,auVar115);
              auVar296 = vrsqrtss_avx(auVar1,auVar1);
              fVar106 = auVar1._0_4_;
              fVar221 = auVar296._0_4_;
              fVar221 = fVar221 * 1.5 + fVar106 * -0.5 * fVar221 * fVar221 * fVar221;
              auVar296 = vdpps_avx(_local_aa0,local_900,0x7f);
              local_940._0_16_ = vfnmadd231ss_fma(auVar113,auVar260,ZEXT416((uint)fVar217));
              auVar113 = vfnmadd231ss_fma(auVar296,auVar260,local_ac0._0_16_);
              if (fVar106 < 0.0) {
                local_980._0_16_ = auVar260;
                local_9a0._0_4_ = auVar2._0_4_;
                local_760._0_16_ = ZEXT416((uint)fVar217);
                local_780._0_4_ = fVar221;
                local_7a0._0_16_ = auVar113;
                fVar106 = sqrtf(fVar106);
                auVar290 = ZEXT464((uint)local_9a0._0_4_);
                auVar216 = ZEXT464((uint)local_a20._0_4_);
                fVar221 = (float)local_780._0_4_;
                auVar113 = local_7a0._0_16_;
                auVar260 = local_980._0_16_;
                auVar296 = local_760._0_16_;
              }
              else {
                auVar296 = vsqrtss_avx(auVar1,auVar1);
                fVar106 = auVar296._0_4_;
                auVar296 = ZEXT416((uint)fVar217);
              }
              auVar278 = ZEXT1664(auVar260);
              auVar245 = ZEXT1664(local_ae0._0_16_);
              auVar1 = vpermilps_avx(local_700._0_16_,0xff);
              auVar2 = vshufps_avx(local_ae0._0_16_,local_ae0._0_16_,0xff);
              auVar141 = vfmsub213ss_fma(local_940._0_16_,ZEXT416((uint)fVar221),auVar2);
              auVar198._0_8_ = local_ac0._0_8_ ^ 0x8000000080000000;
              auVar198._8_4_ = local_ac0._8_4_ ^ 0x80000000;
              auVar198._12_4_ = local_ac0._12_4_ ^ 0x80000000;
              auVar212._0_8_ = auVar141._0_8_ ^ 0x8000000080000000;
              auVar212._8_4_ = auVar141._8_4_ ^ 0x80000000;
              auVar212._12_4_ = auVar141._12_4_ ^ 0x80000000;
              auVar113 = ZEXT416((uint)(auVar113._0_4_ * fVar221));
              auVar141 = vfmsub231ss_fma(ZEXT416((uint)(auVar141._0_4_ * local_ac0._0_4_)),auVar296,
                                         auVar113);
              auVar113 = vinsertps_avx(auVar113,auVar198,0x10);
              uVar101 = auVar141._0_4_;
              auVar199._4_4_ = uVar101;
              auVar199._0_4_ = uVar101;
              auVar199._8_4_ = uVar101;
              auVar199._12_4_ = uVar101;
              auVar113 = vdivps_avx(auVar113,auVar199);
              auVar141 = ZEXT416((uint)(fVar106 - auVar1._0_4_));
              auVar1 = vinsertps_avx(auVar260,auVar141,0x10);
              auVar172._0_4_ = auVar1._0_4_ * auVar113._0_4_;
              auVar172._4_4_ = auVar1._4_4_ * auVar113._4_4_;
              auVar172._8_4_ = auVar1._8_4_ * auVar113._8_4_;
              auVar172._12_4_ = auVar1._12_4_ * auVar113._12_4_;
              auVar113 = vinsertps_avx(auVar212,auVar296,0x1c);
              auVar113 = vdivps_avx(auVar113,auVar199);
              auVar296 = vhaddps_avx(auVar172,auVar172);
              auVar200._0_4_ = auVar1._0_4_ * auVar113._0_4_;
              auVar200._4_4_ = auVar1._4_4_ * auVar113._4_4_;
              auVar200._8_4_ = auVar1._8_4_ * auVar113._8_4_;
              auVar200._12_4_ = auVar1._12_4_ * auVar113._12_4_;
              auVar113 = vhaddps_avx(auVar200,auVar200);
              fVar246 = fVar246 - auVar296._0_4_;
              auVar264 = ZEXT464((uint)fVar246);
              fVar206 = fVar206 - auVar113._0_4_;
              auVar272 = ZEXT464((uint)fVar206);
              auVar113 = vandps_avx(auVar260,local_740);
              bVar54 = true;
              if (auVar113._0_4_ < auVar290._0_4_) {
                auVar296 = vfmadd231ss_fma(ZEXT416((uint)(auVar216._0_4_ + auVar290._0_4_)),
                                           local_7c0._0_16_,ZEXT416(0x36000000));
                auVar113 = vandps_avx(auVar141,local_740);
                if (auVar113._0_4_ < auVar296._0_4_) {
                  fVar206 = fVar206 + (float)local_8f0._0_4_;
                  auVar272 = ZEXT464((uint)fVar206);
                  if ((((fVar104 <= fVar206) &&
                       (fVar217 = *(float *)(ray + k * 4 + 0x80), fVar206 <= fVar217)) &&
                      (0.0 <= fVar246)) && (fVar246 <= 1.0)) {
                    auVar8 = vrsqrtss_avx(auVar8,auVar8);
                    fVar221 = auVar8._0_4_;
                    pGVar6 = (context->scene->geometries).items[local_af0].ptr;
                    if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        unaff_BL = true;
                      }
                      else {
                        fVar219 = fVar221 * 1.5 + fVar219 * -0.5 * fVar221 * fVar221 * fVar221;
                        auVar142._0_4_ = fVar219 * (float)local_aa0._0_4_;
                        auVar142._4_4_ = fVar219 * (float)local_aa0._4_4_;
                        auVar142._8_4_ = fVar219 * fStack_a98;
                        auVar142._12_4_ = fVar219 * fStack_a94;
                        auVar1 = vfmadd213ps_fma(auVar2,auVar142,local_ae0._0_16_);
                        auVar8 = vshufps_avx(auVar142,auVar142,0xc9);
                        auVar113 = vshufps_avx(local_ae0._0_16_,local_ae0._0_16_,0xc9);
                        auVar143._0_4_ = auVar142._0_4_ * auVar113._0_4_;
                        auVar143._4_4_ = auVar142._4_4_ * auVar113._4_4_;
                        auVar143._8_4_ = auVar142._8_4_ * auVar113._8_4_;
                        auVar143._12_4_ = auVar142._12_4_ * auVar113._12_4_;
                        auVar296 = vfmsub231ps_fma(auVar143,local_ae0._0_16_,auVar8);
                        auVar8 = vshufps_avx(auVar296,auVar296,0xc9);
                        auVar113 = vshufps_avx(auVar1,auVar1,0xc9);
                        auVar296 = vshufps_avx(auVar296,auVar296,0xd2);
                        auVar116._0_4_ = auVar1._0_4_ * auVar296._0_4_;
                        auVar116._4_4_ = auVar1._4_4_ * auVar296._4_4_;
                        auVar116._8_4_ = auVar1._8_4_ * auVar296._8_4_;
                        auVar116._12_4_ = auVar1._12_4_ * auVar296._12_4_;
                        auVar8 = vfmsub231ps_fma(auVar116,auVar8,auVar113);
                        local_6c0 = (RTCHitN  [16])vshufps_avx(auVar8,auVar8,0x55);
                        auStack_6b0 = vshufps_avx(auVar8,auVar8,0xaa);
                        local_6a0 = auVar8._0_4_;
                        local_680 = ZEXT416(0) << 0x20;
                        local_670 = CONCAT44(uStack_6dc,local_6e0);
                        uStack_668 = CONCAT44(uStack_6d4,uStack_6d8);
                        local_660._4_4_ = uStack_6cc;
                        local_660._0_4_ = local_6d0;
                        local_660._8_4_ = uStack_6c8;
                        local_660._12_4_ = uStack_6c4;
                        vpcmpeqd_avx2(ZEXT1632(local_660),ZEXT1632(local_660));
                        uStack_64c = context->user->instID[0];
                        local_650 = uStack_64c;
                        uStack_648 = uStack_64c;
                        uStack_644 = uStack_64c;
                        uStack_640 = context->user->instPrimID[0];
                        uStack_63c = uStack_640;
                        uStack_638 = uStack_640;
                        uStack_634 = uStack_640;
                        *(float *)(ray + k * 4 + 0x80) = fVar206;
                        local_b00 = *local_9f8;
                        uStack_af8 = local_9f8[1];
                        local_9f0.valid = (int *)&local_b00;
                        local_9f0.geometryUserPtr = pGVar6->userPtr;
                        local_9f0.context = context->user;
                        local_9f0.hit = local_6c0;
                        local_9f0.N = 4;
                        local_9f0.ray = (RTCRayN *)ray;
                        uStack_69c = local_6a0;
                        uStack_698 = local_6a0;
                        uStack_694 = local_6a0;
                        local_690 = fVar246;
                        fStack_68c = fVar246;
                        fStack_688 = fVar246;
                        fStack_684 = fVar246;
                        if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar245 = ZEXT1664(local_ae0._0_16_);
                          auVar278 = ZEXT1664(auVar260);
                          auVar290 = ZEXT1664(auVar290._0_16_);
                          (*pGVar6->occlusionFilterN)(&local_9f0);
                          auVar272 = ZEXT1664(ZEXT416((uint)fVar206));
                          auVar264 = ZEXT1664(ZEXT416((uint)fVar246));
                        }
                        auVar76._8_8_ = uStack_af8;
                        auVar76._0_8_ = local_b00;
                        if (auVar76 == (undefined1  [16])0x0) {
                          auVar8 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar8 = auVar8 ^ _DAT_01febe20;
                        }
                        else {
                          p_Var7 = context->args->filter;
                          if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar245 = ZEXT1664(auVar245._0_16_);
                            auVar278 = ZEXT1664(auVar278._0_16_);
                            auVar290 = ZEXT1664(auVar290._0_16_);
                            (*p_Var7)(&local_9f0);
                            auVar272 = ZEXT1664(ZEXT416((uint)fVar206));
                            auVar264 = ZEXT1664(ZEXT416((uint)fVar246));
                          }
                          auVar77._8_8_ = uStack_af8;
                          auVar77._0_8_ = local_b00;
                          auVar260 = vpcmpeqd_avx((undefined1  [16])0x0,auVar77);
                          auVar8 = auVar260 ^ _DAT_01febe20;
                          auVar173._8_4_ = 0xff800000;
                          auVar173._0_8_ = 0xff800000ff800000;
                          auVar173._12_4_ = 0xff800000;
                          auVar260 = vblendvps_avx(auVar173,*(undefined1 (*) [16])
                                                             (local_9f0.ray + 0x80),auVar260);
                          *(undefined1 (*) [16])(local_9f0.ray + 0x80) = auVar260;
                        }
                        auVar144._8_8_ = 0x100000001;
                        auVar144._0_8_ = 0x100000001;
                        unaff_BL = (auVar144 & auVar8) != (undefined1  [16])0x0;
                        if (!(bool)unaff_BL) {
                          *(float *)(ray + k * 4 + 0x80) = fVar217;
                        }
                      }
                      bVar54 = false;
                      goto LAB_018e52e4;
                    }
                  }
                  bVar54 = false;
                  unaff_BL = 0;
                }
              }
LAB_018e52e4:
              if (!bVar54) goto LAB_018e55d6;
              lVar99 = lVar99 + -1;
            } while (lVar99 != 0);
            unaff_BL = 0;
LAB_018e55d6:
            unaff_BL = unaff_BL & 1;
            uVar100 = CONCAT71(local_7e0._1_7_,local_7e0[0] | unaff_BL);
            uVar101 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar124._4_4_ = uVar101;
            auVar124._0_4_ = uVar101;
            auVar124._8_4_ = uVar101;
            auVar124._12_4_ = uVar101;
            auVar124._16_4_ = uVar101;
            auVar124._20_4_ = uVar101;
            auVar124._24_4_ = uVar101;
            auVar124._28_4_ = uVar101;
            auVar232 = vcmpps_avx(_local_880,auVar124,2);
            auVar122 = vandps_avx(auVar232,local_5e0);
            local_5e0 = local_5e0 & auVar232;
            uVar102 = local_620;
          } while ((((((((local_5e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (local_5e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (local_5e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(local_5e0 >> 0x7f,0) != '\0') ||
                     (local_5e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(local_5e0 >> 0xbf,0) != '\0') ||
                   (local_5e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   local_5e0[0x1f] < '\0');
        }
        auVar161._0_4_ = fVar127 + local_360._0_4_;
        auVar161._4_4_ = fVar127 + local_360._4_4_;
        auVar161._8_4_ = fVar127 + local_360._8_4_;
        auVar161._12_4_ = fVar127 + local_360._12_4_;
        auVar161._16_4_ = fVar127 + local_360._16_4_;
        auVar161._20_4_ = fVar127 + local_360._20_4_;
        auVar161._24_4_ = fVar127 + local_360._24_4_;
        auVar161._28_4_ = fVar127 + local_360._28_4_;
        uVar101 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar205._4_4_ = uVar101;
        auVar205._0_4_ = uVar101;
        auVar205._8_4_ = uVar101;
        auVar205._12_4_ = uVar101;
        auVar205._16_4_ = uVar101;
        auVar205._20_4_ = uVar101;
        auVar205._24_4_ = uVar101;
        auVar205._28_4_ = uVar101;
        auVar232 = vcmpps_avx(auVar161,auVar205,2);
        auVar122 = vandps_avx(local_520,local_500);
        auVar122 = vandps_avx(auVar232,auVar122);
        auVar214._0_4_ = fVar127 + local_320._0_4_;
        auVar214._4_4_ = fVar127 + local_320._4_4_;
        auVar214._8_4_ = fVar127 + local_320._8_4_;
        auVar214._12_4_ = fVar127 + local_320._12_4_;
        auVar214._16_4_ = fVar127 + local_320._16_4_;
        auVar214._20_4_ = fVar127 + local_320._20_4_;
        auVar214._24_4_ = fVar127 + local_320._24_4_;
        auVar214._28_4_ = fVar127 + local_320._28_4_;
        auVar10 = vcmpps_avx(auVar214,auVar205,2);
        auVar232 = vandps_avx(_local_8c0,local_8a0);
        auVar232 = vandps_avx(auVar10,auVar232);
        auVar232 = vorps_avx(auVar122,auVar232);
        if ((((((((auVar232 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar232 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar232 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar232 >> 0x7f,0) != '\0') ||
              (auVar232 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar232 >> 0xbf,0) != '\0') ||
            (auVar232 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar232[0x1f] < '\0') {
          *(undefined1 (*) [32])(auStack_180 + uVar103 * 0x60) = auVar232;
          auVar122 = vblendvps_avx(_local_320,local_360,auVar122);
          *(undefined1 (*) [32])(auStack_160 + uVar103 * 0x60) = auVar122;
          uVar234 = vmovlps_avx(local_8e0);
          *(undefined8 *)(afStack_140 + uVar103 * 0x18) = uVar234;
          auStack_138[uVar103 * 0x18] = (int)uVar102 + 1;
          uVar103 = (ulong)((int)uVar103 + 1);
        }
        auVar216 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                       &
                                                  DAT_3f8000003f800000)))))));
      }
    }
    do {
      if ((int)uVar103 == 0) {
        if ((uVar100 & 1) != 0) {
          return local_b91;
        }
        uVar101 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar125._4_4_ = uVar101;
        auVar125._0_4_ = uVar101;
        auVar125._8_4_ = uVar101;
        auVar125._12_4_ = uVar101;
        auVar125._16_4_ = uVar101;
        auVar125._20_4_ = uVar101;
        auVar125._24_4_ = uVar101;
        auVar125._28_4_ = uVar101;
        auVar122 = vcmpps_avx(local_2e0,auVar125,2);
        uVar96 = vmovmskps_avx(auVar122);
        uVar96 = (uint)local_8c8 & uVar96;
        local_b91 = uVar96 != 0;
        if (!local_b91) {
          return local_b91;
        }
        goto LAB_018e2f15;
      }
      uVar98 = (ulong)((int)uVar103 - 1);
      lVar99 = uVar98 * 0x60;
      auVar122 = *(undefined1 (*) [32])(auStack_160 + lVar99);
      auVar118._0_4_ = fVar127 + auVar122._0_4_;
      auVar118._4_4_ = fVar127 + auVar122._4_4_;
      auVar118._8_4_ = fVar127 + auVar122._8_4_;
      auVar118._12_4_ = fVar127 + auVar122._12_4_;
      auVar118._16_4_ = fVar127 + auVar122._16_4_;
      auVar118._20_4_ = fVar127 + auVar122._20_4_;
      auVar118._24_4_ = fVar127 + auVar122._24_4_;
      auVar118._28_4_ = fVar127 + auVar122._28_4_;
      uVar101 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar204._4_4_ = uVar101;
      auVar204._0_4_ = uVar101;
      auVar204._8_4_ = uVar101;
      auVar204._12_4_ = uVar101;
      auVar204._16_4_ = uVar101;
      auVar204._20_4_ = uVar101;
      auVar204._24_4_ = uVar101;
      auVar204._28_4_ = uVar101;
      auVar232 = vcmpps_avx(auVar118,auVar204,2);
      _local_6c0 = vandps_avx(auVar232,*(undefined1 (*) [32])(auStack_180 + lVar99));
      auVar232 = *(undefined1 (*) [32])(auStack_180 + lVar99) & auVar232;
      bVar72 = (auVar232 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar73 = (auVar232 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar71 = (auVar232 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar70 = SUB321(auVar232 >> 0x7f,0) == '\0';
      bVar69 = (auVar232 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar68 = SUB321(auVar232 >> 0xbf,0) == '\0';
      bVar66 = (auVar232 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar54 = -1 < auVar232[0x1f];
      if (((((((!bVar72 || !bVar73) || !bVar71) || !bVar70) || !bVar69) || !bVar68) || !bVar66) ||
          !bVar54) {
        auVar177._8_4_ = 0x7f800000;
        auVar177._0_8_ = 0x7f8000007f800000;
        auVar177._12_4_ = 0x7f800000;
        auVar177._16_4_ = 0x7f800000;
        auVar177._20_4_ = 0x7f800000;
        auVar177._24_4_ = 0x7f800000;
        auVar177._28_4_ = 0x7f800000;
        auVar122 = vblendvps_avx(auVar177,auVar122,_local_6c0);
        auVar232 = vshufps_avx(auVar122,auVar122,0xb1);
        auVar232 = vminps_avx(auVar122,auVar232);
        auVar10 = vshufpd_avx(auVar232,auVar232,5);
        auVar232 = vminps_avx(auVar232,auVar10);
        auVar10 = vpermpd_avx2(auVar232,0x4e);
        auVar232 = vminps_avx(auVar232,auVar10);
        auVar232 = vcmpps_avx(auVar122,auVar232,0);
        auVar10 = _local_6c0 & auVar232;
        auVar122 = _local_6c0;
        if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar10 >> 0x7f,0) != '\0') ||
              (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar10 >> 0xbf,0) != '\0') ||
            (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar10[0x1f] < '\0') {
          auVar122 = vandps_avx(auVar232,_local_6c0);
        }
        fVar206 = afStack_140[uVar98 * 0x18 + 1];
        uVar102 = (ulong)auStack_138[uVar98 * 0x18];
        uVar96 = vmovmskps_avx(auVar122);
        iVar14 = 0;
        for (; (uVar96 & 1) == 0; uVar96 = uVar96 >> 1 | 0x80000000) {
          iVar14 = iVar14 + 1;
        }
        fVar217 = afStack_140[uVar98 * 0x18];
        auVar119._4_4_ = fVar217;
        auVar119._0_4_ = fVar217;
        auVar119._8_4_ = fVar217;
        auVar119._12_4_ = fVar217;
        auVar119._16_4_ = fVar217;
        auVar119._20_4_ = fVar217;
        auVar119._24_4_ = fVar217;
        auVar119._28_4_ = fVar217;
        *(undefined4 *)(local_6c0 + (uint)(iVar14 << 2)) = 0;
        *(undefined1 (*) [32])(auStack_180 + lVar99) = _local_6c0;
        if ((((((((_local_6c0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (_local_6c0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (_local_6c0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(_local_6c0 >> 0x7f,0) != '\0') ||
              (_local_6c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(_local_6c0 >> 0xbf,0) != '\0') ||
            (_local_6c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_6c0[0x1f] < '\0') {
          uVar98 = uVar103;
        }
        fVar206 = fVar206 - fVar217;
        auVar152._4_4_ = fVar206;
        auVar152._0_4_ = fVar206;
        auVar152._8_4_ = fVar206;
        auVar152._12_4_ = fVar206;
        auVar152._16_4_ = fVar206;
        auVar152._20_4_ = fVar206;
        auVar152._24_4_ = fVar206;
        auVar152._28_4_ = fVar206;
        auVar8 = vfmadd132ps_fma(auVar152,auVar119,_DAT_02020f20);
        local_360 = ZEXT1632(auVar8);
        local_8e0._8_8_ = 0;
        local_8e0._0_8_ = *(ulong *)(local_360 + (uint)(iVar14 << 2));
      }
      uVar103 = uVar98;
    } while (((((((bVar72 && bVar73) && bVar71) && bVar70) && bVar69) && bVar68) && bVar66) &&
             bVar54);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }